

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86::forward(InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  int iVar9;
  void *pvVar10;
  void *pvVar11;
  undefined4 *puVar12;
  int *piVar13;
  void *pvVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  int iVar28;
  undefined1 (*pauVar29) [16];
  float *pfVar30;
  byte bVar31;
  ulong uVar32;
  float *pfVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  float *pfVar38;
  float *pfVar39;
  uint uVar40;
  uint uVar41;
  undefined1 (*pauVar42) [16];
  long lVar43;
  long lVar44;
  uint uVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  float *pfVar49;
  int p_3;
  float fVar60;
  float fVar61;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  v4sf one;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar168;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  Option opt_flatten;
  long local_150;
  uint local_138;
  uint local_100;
  float *local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  int local_e0;
  Allocator *local_d8;
  int local_d0;
  int iStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  int iStack_c0;
  size_t local_b8;
  undefined1 local_a8 [16];
  Mat *local_90;
  ulong local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar28 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar28;
  }
  local_d0 = bottom_blob->dims;
  if ((local_d0 == 2) &&
     (iVar28 = (this->super_InnerProduct).num_output,
     bottom_blob->w == (this->super_InnerProduct).weight_data_size / iVar28)) {
    Mat::create(top_blob,iVar28,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    local_80 = (long)bottom_blob->h;
    if (0 < local_80) {
      iVar28 = (this->super_InnerProduct).activation_type;
      uVar41 = bottom_blob->w;
      uVar48 = (ulong)top_blob->w;
      bVar31 = (uVar48 & 3) == 0 & opt->use_packing_layout;
      pvVar10 = (this->super_InnerProduct).bias_data.data;
      iVar9 = bottom_blob->elempack;
      uVar40 = top_blob->w >> 2;
      local_88 = (ulong)uVar40;
      local_150 = 0;
      local_90 = bottom_blob;
      do {
        if ((iVar9 == 4 & bVar31 & 0 < (int)uVar40) != 0) {
          pauVar29 = (undefined1 (*) [16])
                     (top_blob->w * local_150 * top_blob->elemsize + (long)top_blob->data);
          uVar32 = 0;
          do {
            if (pvVar10 == (void *)0x0) {
              auVar51 = ZEXT816(0);
            }
            else {
              auVar51 = *(undefined1 (*) [16])((long)pvVar10 + uVar32 * 0x10);
            }
            auVar64 = auVar51;
            auVar81 = auVar51;
            auVar109 = auVar51;
            if (0 < (int)uVar41) {
              lVar37 = local_90->elemsize * local_150 * (long)local_90->w;
              pvVar11 = local_90->data;
              lVar43 = 0;
              auVar119 = auVar51;
              auVar121 = auVar51;
              auVar122 = auVar51;
              auVar107 = auVar51;
              uVar45 = uVar41;
              do {
                auVar137._0_4_ = *(float *)((long)pvVar11 + lVar43 + lVar37);
                fVar60 = *(float *)((long)pvVar11 + lVar43 + lVar37 + 4);
                fVar61 = *(float *)((long)pvVar11 + lVar43 + lVar37 + 8);
                fVar62 = *(float *)((long)pvVar11 + lVar43 + lVar37 + 0xc);
                pfVar38 = (float *)((long)(this->weight_data_tm).data +
                                   lVar43 + (this->weight_data_tm).elemsize * uVar32 *
                                            (long)(this->weight_data_tm).w);
                fVar168 = *pfVar38;
                fVar172 = pfVar38[1];
                fVar173 = pfVar38[2];
                fVar174 = pfVar38[3];
                auVar51._0_4_ = auVar119._0_4_ + auVar137._0_4_ * fVar168;
                auVar51._4_4_ = auVar119._4_4_ + auVar137._0_4_ * fVar172;
                auVar51._8_4_ = auVar119._8_4_ + auVar137._0_4_ * fVar173;
                auVar51._12_4_ = auVar119._12_4_ + auVar137._0_4_ * fVar174;
                auVar109._0_4_ = auVar107._0_4_ + fVar60 * fVar168;
                auVar109._4_4_ = auVar107._4_4_ + fVar60 * fVar172;
                auVar109._8_4_ = auVar107._8_4_ + fVar60 * fVar173;
                auVar109._12_4_ = auVar107._12_4_ + fVar60 * fVar174;
                auVar64._0_4_ = auVar121._0_4_ + fVar61 * fVar168;
                auVar64._4_4_ = auVar121._4_4_ + fVar61 * fVar172;
                auVar64._8_4_ = auVar121._8_4_ + fVar61 * fVar173;
                auVar64._12_4_ = auVar121._12_4_ + fVar61 * fVar174;
                auVar81._0_4_ = auVar122._0_4_ + fVar62 * fVar168;
                auVar81._4_4_ = auVar122._4_4_ + fVar62 * fVar172;
                auVar81._8_4_ = auVar122._8_4_ + fVar62 * fVar173;
                auVar81._12_4_ = auVar122._12_4_ + fVar62 * fVar174;
                lVar43 = lVar43 + 0x10;
                uVar45 = uVar45 - 1;
                auVar119 = auVar51;
                auVar121 = auVar64;
                auVar122 = auVar81;
                auVar107 = auVar109;
              } while (uVar45 != 0);
            }
            iVar36 = iVar28 + -1;
            auVar137._0_4_ = auVar51._4_4_;
            fVar60 = auVar51._8_4_;
            fVar61 = auVar51._12_4_;
            switch(iVar36) {
            case 0:
              auVar51 = maxps(auVar51,_DAT_005f1060);
              break;
            case 1:
              auVar121 = maxps(auVar51,ZEXT816(0));
              auVar119 = minps(auVar51,ZEXT816(0));
              auVar137._0_4_ = *(this->super_InnerProduct).activation_params.data;
              auVar51._4_4_ = auVar137._0_4_ * auVar119._4_4_ + auVar121._4_4_;
              auVar51._0_4_ = auVar137._0_4_ * auVar119._0_4_ + auVar121._0_4_;
              auVar51._8_4_ = auVar137._0_4_ * auVar119._8_4_ + auVar121._8_4_;
              auVar51._12_4_ = auVar137._0_4_ * auVar119._12_4_ + auVar121._12_4_;
              break;
            case 2:
              puVar12 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar7 = *puVar12;
              uVar6 = puVar12[1];
              auVar120._4_4_ = uVar7;
              auVar120._0_4_ = uVar7;
              auVar120._8_4_ = uVar7;
              auVar120._12_4_ = uVar7;
              auVar141._4_4_ = uVar6;
              auVar141._0_4_ = uVar6;
              auVar141._8_4_ = uVar6;
              auVar141._12_4_ = uVar6;
              auVar51 = maxps(auVar51,auVar120);
              auVar51 = minps(auVar51,auVar141);
              break;
            case 3:
              auVar50._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
              auVar50._8_4_ = -fVar60;
              auVar50._12_4_ = -fVar61;
              auVar51 = minps(auVar50,_DAT_005f2e60);
              auVar51 = maxps(auVar51,_DAT_005f2e70);
              fVar60 = auVar51._0_4_ * 1.442695 + 0.5;
              fVar62 = auVar51._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar51._8_4_ * 1.442695 + 0.5;
              fVar174 = auVar51._12_4_ * 1.442695 + 0.5;
              auVar137._0_4_ = (float)(int)fVar60;
              fVar61 = (float)(int)fVar62;
              fVar168 = (float)(int)fVar172;
              fVar173 = (float)(int)fVar174;
              auVar137._0_4_ =
                   auVar137._0_4_ - (float)(-(uint)(fVar60 < auVar137._0_4_) & 0x3f800000);
              fVar61 = fVar61 - (float)(-(uint)(fVar62 < fVar61) & 0x3f800000);
              fVar168 = fVar168 - (float)(-(uint)(fVar172 < fVar168) & 0x3f800000);
              fVar173 = fVar173 - (float)(-(uint)(fVar174 < fVar173) & 0x3f800000);
              fVar60 = auVar137._0_4_ * -0.6931472 + auVar51._0_4_;
              fVar62 = fVar61 * -0.6931472 + auVar51._4_4_;
              fVar172 = fVar168 * -0.6931472 + auVar51._8_4_;
              fVar174 = fVar173 * -0.6931472 + auVar51._12_4_;
              auVar142._0_4_ =
                   (float)((int)auVar137._0_4_ * 0x800000 + 0x3f800000) *
                   (fVar60 + 1.0 +
                   (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                     0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60) + 1.0;
              auVar142._4_4_ =
                   (float)((int)fVar61 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar142._8_4_ =
                   (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar142._12_4_ =
                   (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                   (fVar174 + 1.0 +
                   (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                     0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                   1.0;
              auVar52._8_4_ = 0x3f800000;
              auVar52._0_8_ = 0x3f8000003f800000;
              auVar52._12_4_ = 0x3f800000;
              auVar51 = divps(auVar52,auVar142);
              break;
            case 4:
              auVar119 = minps(auVar51,_DAT_005f2e60);
              auVar119 = maxps(auVar119,_DAT_005f2e70);
              fVar62 = auVar119._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar119._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar119._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar119._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar119._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar119._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar119._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar119._12_4_ - fVar166 * 0.6931472;
              auVar138._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar138._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar138._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar138._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar119 = maxps(auVar138,_DAT_005f2f10);
              fVar62 = (float)(auVar119._0_4_ & 0x807fffff | 0x3f000000);
              fVar172 = (float)(auVar119._4_4_ & 0x807fffff | 0x3f000000);
              fVar174 = (float)(auVar119._8_4_ & 0x807fffff | 0x3f000000);
              fVar165 = (float)(auVar119._12_4_ & 0x807fffff | 0x3f000000);
              fVar168 = fVar62 + -1.0 + (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar62);
              fVar173 = fVar172 + -1.0 + (float)(-(uint)(fVar172 < 0.70710677) & (uint)fVar172);
              fVar160 = fVar174 + -1.0 + (float)(-(uint)(fVar174 < 0.70710677) & (uint)fVar174);
              fVar166 = fVar165 + -1.0 + (float)(-(uint)(fVar165 < 0.70710677) & (uint)fVar165);
              auVar139._0_4_ =
                   ~-(uint)(auVar138._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar62 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar168
                          + (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
              auVar139._4_4_ =
                   ~-(uint)(auVar138._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar172 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar173 +
                          (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) *
                                 fVar173 + -0.12420141) * fVar173 + 0.14249323) * fVar173 +
                              -0.16668057) * fVar173 + 0.20000714) * fVar173 + -0.24999994) *
                            fVar173 + 0.3333333) * fVar173 + -0.5) * fVar173 * fVar173) * -2.0);
              auVar139._8_4_ =
                   ~-(uint)(auVar138._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar174 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar160 +
                          (((((((((fVar160 * 0.070376836 + -0.1151461) * fVar160 + 0.116769984) *
                                 fVar160 + -0.12420141) * fVar160 + 0.14249323) * fVar160 +
                              -0.16668057) * fVar160 + 0.20000714) * fVar160 + -0.24999994) *
                            fVar160 + 0.3333333) * fVar160 + -0.5) * fVar160 * fVar160) * -2.0);
              auVar139._12_4_ =
                   ~-(uint)(auVar138._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar165 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar166 +
                          (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) *
                                 fVar166 + -0.12420141) * fVar166 + 0.14249323) * fVar166 +
                              -0.16668057) * fVar166 + 0.20000714) * fVar166 + -0.24999994) *
                            fVar166 + 0.3333333) * fVar166 + -0.5) * fVar166 * fVar166) * -2.0);
              auVar107._0_8_ =
                   CONCAT44(-(uint)(auVar138._4_4_ <= 0.0),-(uint)(auVar138._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar107._8_4_ = -(uint)(auVar138._8_4_ <= 0.0) & 0x7fffffff;
              auVar107._12_4_ = -(uint)(auVar138._12_4_ <= 0.0) & 0x7fffffff;
              auVar119 = minps(auVar107 | auVar139,_DAT_005f2e60);
              auVar119 = maxps(auVar119,_DAT_005f2e70);
              fVar62 = auVar119._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar119._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar119._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar119._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar119._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar119._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar119._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar119._12_4_ - fVar166 * 0.6931472;
              auVar140._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar140._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar140._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar140._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar119 = divps(_DAT_005f3b20,auVar140);
              auVar122._0_4_ = auVar119._0_4_ + -1.0;
              auVar122._4_4_ = auVar119._4_4_ + -1.0;
              auVar122._8_4_ = auVar119._8_4_ + -1.0;
              auVar122._12_4_ = auVar119._12_4_ + -1.0;
              goto LAB_002c3e4f;
            case 5:
              pfVar38 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar62 = *pfVar38;
              fVar168 = pfVar38[1];
              auVar121._0_4_ = fVar62 * auVar51._0_4_ + fVar168;
              auVar121._4_4_ = fVar62 * auVar137._0_4_ + fVar168;
              auVar121._8_4_ = fVar62 * fVar60 + fVar168;
              auVar121._12_4_ = fVar62 * fVar61 + fVar168;
              auVar121 = maxps(auVar121,_DAT_005f1060);
              auVar119._8_4_ = 0x3f800000;
              auVar119._0_8_ = 0x3f8000003f800000;
              auVar119._12_4_ = 0x3f800000;
              auVar122 = minps(auVar121,auVar119);
LAB_002c3e4f:
              auVar51._0_4_ = auVar51._0_4_ * auVar122._0_4_;
              auVar51._4_4_ = auVar137._0_4_ * auVar122._4_4_;
              auVar51._8_4_ = fVar60 * auVar122._8_4_;
              auVar51._12_4_ = fVar61 * auVar122._12_4_;
            }
            auVar137._0_4_ = auVar109._4_4_;
            fVar60 = auVar109._8_4_;
            fVar61 = auVar109._12_4_;
            switch(iVar36) {
            case 0:
              auVar109 = maxps(auVar109,_DAT_005f1060);
              break;
            case 1:
              auVar121 = maxps(auVar109,ZEXT816(0));
              auVar119 = minps(auVar109,ZEXT816(0));
              auVar137._0_4_ = *(this->super_InnerProduct).activation_params.data;
              auVar109._4_4_ = auVar137._0_4_ * auVar119._4_4_ + auVar121._4_4_;
              auVar109._0_4_ = auVar137._0_4_ * auVar119._0_4_ + auVar121._0_4_;
              auVar109._8_4_ = auVar137._0_4_ * auVar119._8_4_ + auVar121._8_4_;
              auVar109._12_4_ = auVar137._0_4_ * auVar119._12_4_ + auVar121._12_4_;
              break;
            case 2:
              puVar12 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar7 = *puVar12;
              uVar6 = puVar12[1];
              auVar124._4_4_ = uVar7;
              auVar124._0_4_ = uVar7;
              auVar124._8_4_ = uVar7;
              auVar124._12_4_ = uVar7;
              auVar146._4_4_ = uVar6;
              auVar146._0_4_ = uVar6;
              auVar146._8_4_ = uVar6;
              auVar146._12_4_ = uVar6;
              auVar109 = maxps(auVar109,auVar124);
              auVar109 = minps(auVar109,auVar146);
              break;
            case 3:
              auVar108._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
              auVar108._8_4_ = -fVar60;
              auVar108._12_4_ = -fVar61;
              auVar109 = minps(auVar108,_DAT_005f2e60);
              auVar109 = maxps(auVar109,_DAT_005f2e70);
              fVar60 = auVar109._0_4_ * 1.442695 + 0.5;
              fVar62 = auVar109._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar109._8_4_ * 1.442695 + 0.5;
              fVar174 = auVar109._12_4_ * 1.442695 + 0.5;
              auVar137._0_4_ = (float)(int)fVar60;
              fVar61 = (float)(int)fVar62;
              fVar168 = (float)(int)fVar172;
              fVar173 = (float)(int)fVar174;
              auVar137._0_4_ =
                   auVar137._0_4_ - (float)(-(uint)(fVar60 < auVar137._0_4_) & 0x3f800000);
              fVar61 = fVar61 - (float)(-(uint)(fVar62 < fVar61) & 0x3f800000);
              fVar168 = fVar168 - (float)(-(uint)(fVar172 < fVar168) & 0x3f800000);
              fVar173 = fVar173 - (float)(-(uint)(fVar174 < fVar173) & 0x3f800000);
              fVar60 = auVar137._0_4_ * -0.6931472 + auVar109._0_4_;
              fVar62 = fVar61 * -0.6931472 + auVar109._4_4_;
              fVar172 = fVar168 * -0.6931472 + auVar109._8_4_;
              fVar174 = fVar173 * -0.6931472 + auVar109._12_4_;
              auVar147._0_4_ =
                   (float)((int)auVar137._0_4_ * 0x800000 + 0x3f800000) *
                   (fVar60 + 1.0 +
                   (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                     0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60) + 1.0;
              auVar147._4_4_ =
                   (float)((int)fVar61 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar147._8_4_ =
                   (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar147._12_4_ =
                   (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                   (fVar174 + 1.0 +
                   (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                     0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                   1.0;
              auVar110._8_4_ = 0x3f800000;
              auVar110._0_8_ = 0x3f8000003f800000;
              auVar110._12_4_ = 0x3f800000;
              auVar109 = divps(auVar110,auVar147);
              break;
            case 4:
              auVar119 = minps(auVar109,_DAT_005f2e60);
              auVar119 = maxps(auVar119,_DAT_005f2e70);
              fVar62 = auVar119._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar119._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar119._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar119._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar119._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar119._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar119._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar119._12_4_ - fVar166 * 0.6931472;
              auVar143._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar143._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar143._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar143._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar119 = maxps(auVar143,_DAT_005f2f10);
              fVar62 = (float)(auVar119._0_4_ & 0x807fffff | 0x3f000000);
              fVar172 = (float)(auVar119._4_4_ & 0x807fffff | 0x3f000000);
              fVar174 = (float)(auVar119._8_4_ & 0x807fffff | 0x3f000000);
              fVar165 = (float)(auVar119._12_4_ & 0x807fffff | 0x3f000000);
              fVar168 = fVar62 + -1.0 + (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar62);
              fVar173 = fVar172 + -1.0 + (float)(-(uint)(fVar172 < 0.70710677) & (uint)fVar172);
              fVar160 = fVar174 + -1.0 + (float)(-(uint)(fVar174 < 0.70710677) & (uint)fVar174);
              fVar166 = fVar165 + -1.0 + (float)(-(uint)(fVar165 < 0.70710677) & (uint)fVar165);
              auVar144._0_4_ =
                   ~-(uint)(auVar143._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar62 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar168
                          + (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
              auVar144._4_4_ =
                   ~-(uint)(auVar143._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar172 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar173 +
                          (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) *
                                 fVar173 + -0.12420141) * fVar173 + 0.14249323) * fVar173 +
                              -0.16668057) * fVar173 + 0.20000714) * fVar173 + -0.24999994) *
                            fVar173 + 0.3333333) * fVar173 + -0.5) * fVar173 * fVar173) * -2.0);
              auVar144._8_4_ =
                   ~-(uint)(auVar143._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar174 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar160 +
                          (((((((((fVar160 * 0.070376836 + -0.1151461) * fVar160 + 0.116769984) *
                                 fVar160 + -0.12420141) * fVar160 + 0.14249323) * fVar160 +
                              -0.16668057) * fVar160 + 0.20000714) * fVar160 + -0.24999994) *
                            fVar160 + 0.3333333) * fVar160 + -0.5) * fVar160 * fVar160) * -2.0);
              auVar144._12_4_ =
                   ~-(uint)(auVar143._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar165 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar166 +
                          (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) *
                                 fVar166 + -0.12420141) * fVar166 + 0.14249323) * fVar166 +
                              -0.16668057) * fVar166 + 0.20000714) * fVar166 + -0.24999994) *
                            fVar166 + 0.3333333) * fVar166 + -0.5) * fVar166 * fVar166) * -2.0);
              auVar123._0_8_ =
                   CONCAT44(-(uint)(auVar143._4_4_ <= 0.0),-(uint)(auVar143._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar123._8_4_ = -(uint)(auVar143._8_4_ <= 0.0) & 0x7fffffff;
              auVar123._12_4_ = -(uint)(auVar143._12_4_ <= 0.0) & 0x7fffffff;
              auVar119 = minps(auVar123 | auVar144,_DAT_005f2e60);
              auVar119 = maxps(auVar119,_DAT_005f2e70);
              fVar62 = auVar119._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar119._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar119._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar119._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar119._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar119._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar119._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar119._12_4_ - fVar166 * 0.6931472;
              auVar145._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar145._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar145._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar145._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar119 = divps(_DAT_005f3b20,auVar145);
              auVar126._0_4_ = auVar119._0_4_ + -1.0;
              auVar126._4_4_ = auVar119._4_4_ + -1.0;
              auVar126._8_4_ = auVar119._8_4_ + -1.0;
              auVar126._12_4_ = auVar119._12_4_ + -1.0;
              goto LAB_002c41cc;
            case 5:
              pfVar38 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar62 = *pfVar38;
              fVar168 = pfVar38[1];
              auVar125._0_4_ = fVar62 * auVar109._0_4_ + fVar168;
              auVar125._4_4_ = fVar62 * auVar137._0_4_ + fVar168;
              auVar125._8_4_ = fVar62 * fVar60 + fVar168;
              auVar125._12_4_ = fVar62 * fVar61 + fVar168;
              auVar119 = maxps(auVar125,_DAT_005f1060);
              auVar15._8_4_ = 0x3f800000;
              auVar15._0_8_ = 0x3f8000003f800000;
              auVar15._12_4_ = 0x3f800000;
              auVar126 = minps(auVar119,auVar15);
LAB_002c41cc:
              auVar109._0_4_ = auVar109._0_4_ * auVar126._0_4_;
              auVar109._4_4_ = auVar137._0_4_ * auVar126._4_4_;
              auVar109._8_4_ = fVar60 * auVar126._8_4_;
              auVar109._12_4_ = fVar61 * auVar126._12_4_;
            }
            auVar137._0_4_ = auVar64._4_4_;
            fVar60 = auVar64._8_4_;
            fVar61 = auVar64._12_4_;
            switch(iVar36) {
            case 0:
              auVar64 = maxps(auVar64,_DAT_005f1060);
              break;
            case 1:
              auVar121 = maxps(auVar64,ZEXT816(0));
              auVar119 = minps(auVar64,ZEXT816(0));
              auVar137._0_4_ = *(this->super_InnerProduct).activation_params.data;
              auVar64._4_4_ = auVar137._0_4_ * auVar119._4_4_ + auVar121._4_4_;
              auVar64._0_4_ = auVar137._0_4_ * auVar119._0_4_ + auVar121._0_4_;
              auVar64._8_4_ = auVar137._0_4_ * auVar119._8_4_ + auVar121._8_4_;
              auVar64._12_4_ = auVar137._0_4_ * auVar119._12_4_ + auVar121._12_4_;
              break;
            case 2:
              puVar12 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar7 = *puVar12;
              uVar6 = puVar12[1];
              auVar128._4_4_ = uVar7;
              auVar128._0_4_ = uVar7;
              auVar128._8_4_ = uVar7;
              auVar128._12_4_ = uVar7;
              auVar151._4_4_ = uVar6;
              auVar151._0_4_ = uVar6;
              auVar151._8_4_ = uVar6;
              auVar151._12_4_ = uVar6;
              auVar64 = maxps(auVar64,auVar128);
              auVar64 = minps(auVar64,auVar151);
              break;
            case 3:
              auVar63._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
              auVar63._8_4_ = -fVar60;
              auVar63._12_4_ = -fVar61;
              auVar64 = minps(auVar63,_DAT_005f2e60);
              auVar64 = maxps(auVar64,_DAT_005f2e70);
              fVar60 = auVar64._0_4_ * 1.442695 + 0.5;
              fVar62 = auVar64._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar64._8_4_ * 1.442695 + 0.5;
              fVar174 = auVar64._12_4_ * 1.442695 + 0.5;
              auVar137._0_4_ = (float)(int)fVar60;
              fVar61 = (float)(int)fVar62;
              fVar168 = (float)(int)fVar172;
              fVar173 = (float)(int)fVar174;
              auVar137._0_4_ =
                   auVar137._0_4_ - (float)(-(uint)(fVar60 < auVar137._0_4_) & 0x3f800000);
              fVar61 = fVar61 - (float)(-(uint)(fVar62 < fVar61) & 0x3f800000);
              fVar168 = fVar168 - (float)(-(uint)(fVar172 < fVar168) & 0x3f800000);
              fVar173 = fVar173 - (float)(-(uint)(fVar174 < fVar173) & 0x3f800000);
              fVar60 = auVar137._0_4_ * -0.6931472 + auVar64._0_4_;
              fVar62 = fVar61 * -0.6931472 + auVar64._4_4_;
              fVar172 = fVar168 * -0.6931472 + auVar64._8_4_;
              fVar174 = fVar173 * -0.6931472 + auVar64._12_4_;
              auVar152._0_4_ =
                   (float)((int)auVar137._0_4_ * 0x800000 + 0x3f800000) *
                   (fVar60 + 1.0 +
                   (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                     0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60) + 1.0;
              auVar152._4_4_ =
                   (float)((int)fVar61 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar152._8_4_ =
                   (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar152._12_4_ =
                   (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                   (fVar174 + 1.0 +
                   (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                     0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                   1.0;
              auVar65._8_4_ = 0x3f800000;
              auVar65._0_8_ = 0x3f8000003f800000;
              auVar65._12_4_ = 0x3f800000;
              auVar64 = divps(auVar65,auVar152);
              break;
            case 4:
              auVar119 = minps(auVar64,_DAT_005f2e60);
              auVar119 = maxps(auVar119,_DAT_005f2e70);
              fVar62 = auVar119._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar119._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar119._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar119._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar119._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar119._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar119._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar119._12_4_ - fVar166 * 0.6931472;
              auVar148._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar148._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar148._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar148._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar119 = maxps(auVar148,_DAT_005f2f10);
              fVar62 = (float)(auVar119._0_4_ & 0x807fffff | 0x3f000000);
              fVar172 = (float)(auVar119._4_4_ & 0x807fffff | 0x3f000000);
              fVar174 = (float)(auVar119._8_4_ & 0x807fffff | 0x3f000000);
              fVar165 = (float)(auVar119._12_4_ & 0x807fffff | 0x3f000000);
              fVar168 = fVar62 + -1.0 + (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar62);
              fVar173 = fVar172 + -1.0 + (float)(-(uint)(fVar172 < 0.70710677) & (uint)fVar172);
              fVar160 = fVar174 + -1.0 + (float)(-(uint)(fVar174 < 0.70710677) & (uint)fVar174);
              fVar166 = fVar165 + -1.0 + (float)(-(uint)(fVar165 < 0.70710677) & (uint)fVar165);
              auVar149._0_4_ =
                   ~-(uint)(auVar148._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar62 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar168
                          + (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
              auVar149._4_4_ =
                   ~-(uint)(auVar148._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar172 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar173 +
                          (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) *
                                 fVar173 + -0.12420141) * fVar173 + 0.14249323) * fVar173 +
                              -0.16668057) * fVar173 + 0.20000714) * fVar173 + -0.24999994) *
                            fVar173 + 0.3333333) * fVar173 + -0.5) * fVar173 * fVar173) * -2.0);
              auVar149._8_4_ =
                   ~-(uint)(auVar148._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar174 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar160 +
                          (((((((((fVar160 * 0.070376836 + -0.1151461) * fVar160 + 0.116769984) *
                                 fVar160 + -0.12420141) * fVar160 + 0.14249323) * fVar160 +
                              -0.16668057) * fVar160 + 0.20000714) * fVar160 + -0.24999994) *
                            fVar160 + 0.3333333) * fVar160 + -0.5) * fVar160 * fVar160) * -2.0);
              auVar149._12_4_ =
                   ~-(uint)(auVar148._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar165 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar166 +
                          (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) *
                                 fVar166 + -0.12420141) * fVar166 + 0.14249323) * fVar166 +
                              -0.16668057) * fVar166 + 0.20000714) * fVar166 + -0.24999994) *
                            fVar166 + 0.3333333) * fVar166 + -0.5) * fVar166 * fVar166) * -2.0);
              auVar127._0_8_ =
                   CONCAT44(-(uint)(auVar148._4_4_ <= 0.0),-(uint)(auVar148._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar127._8_4_ = -(uint)(auVar148._8_4_ <= 0.0) & 0x7fffffff;
              auVar127._12_4_ = -(uint)(auVar148._12_4_ <= 0.0) & 0x7fffffff;
              auVar119 = minps(auVar127 | auVar149,_DAT_005f2e60);
              auVar119 = maxps(auVar119,_DAT_005f2e70);
              fVar62 = auVar119._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar119._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar119._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar119._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar119._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar119._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar119._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar119._12_4_ - fVar166 * 0.6931472;
              auVar150._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar150._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar150._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar150._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar119 = divps(_DAT_005f3b20,auVar150);
              auVar130._0_4_ = auVar119._0_4_ + -1.0;
              auVar130._4_4_ = auVar119._4_4_ + -1.0;
              auVar130._8_4_ = auVar119._8_4_ + -1.0;
              auVar130._12_4_ = auVar119._12_4_ + -1.0;
              goto LAB_002c4549;
            case 5:
              pfVar38 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar62 = *pfVar38;
              fVar168 = pfVar38[1];
              auVar129._0_4_ = fVar62 * auVar64._0_4_ + fVar168;
              auVar129._4_4_ = fVar62 * auVar137._0_4_ + fVar168;
              auVar129._8_4_ = fVar62 * fVar60 + fVar168;
              auVar129._12_4_ = fVar62 * fVar61 + fVar168;
              auVar119 = maxps(auVar129,_DAT_005f1060);
              auVar16._8_4_ = 0x3f800000;
              auVar16._0_8_ = 0x3f8000003f800000;
              auVar16._12_4_ = 0x3f800000;
              auVar130 = minps(auVar119,auVar16);
LAB_002c4549:
              auVar64._0_4_ = auVar64._0_4_ * auVar130._0_4_;
              auVar64._4_4_ = auVar137._0_4_ * auVar130._4_4_;
              auVar64._8_4_ = fVar60 * auVar130._8_4_;
              auVar64._12_4_ = fVar61 * auVar130._12_4_;
            }
            auVar137._0_4_ = auVar81._4_4_;
            fVar60 = auVar81._8_4_;
            fVar61 = auVar81._12_4_;
            switch(iVar36) {
            case 0:
              auVar81 = maxps(auVar81,_DAT_005f1060);
              break;
            case 1:
              auVar121 = maxps(auVar81,ZEXT816(0));
              auVar119 = minps(auVar81,ZEXT816(0));
              auVar137._0_4_ = *(this->super_InnerProduct).activation_params.data;
              auVar81._4_4_ = auVar137._0_4_ * auVar119._4_4_ + auVar121._4_4_;
              auVar81._0_4_ = auVar137._0_4_ * auVar119._0_4_ + auVar121._0_4_;
              auVar81._8_4_ = auVar137._0_4_ * auVar119._8_4_ + auVar121._8_4_;
              auVar81._12_4_ = auVar137._0_4_ * auVar119._12_4_ + auVar121._12_4_;
              break;
            case 2:
              puVar12 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar7 = *puVar12;
              uVar6 = puVar12[1];
              auVar132._4_4_ = uVar7;
              auVar132._0_4_ = uVar7;
              auVar132._8_4_ = uVar7;
              auVar132._12_4_ = uVar7;
              auVar156._4_4_ = uVar6;
              auVar156._0_4_ = uVar6;
              auVar156._8_4_ = uVar6;
              auVar156._12_4_ = uVar6;
              auVar81 = maxps(auVar81,auVar132);
              auVar81 = minps(auVar81,auVar156);
              break;
            case 3:
              auVar80._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
              auVar80._8_4_ = -fVar60;
              auVar80._12_4_ = -fVar61;
              auVar81 = minps(auVar80,_DAT_005f2e60);
              auVar81 = maxps(auVar81,_DAT_005f2e70);
              fVar60 = auVar81._0_4_ * 1.442695 + 0.5;
              fVar62 = auVar81._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar81._8_4_ * 1.442695 + 0.5;
              fVar174 = auVar81._12_4_ * 1.442695 + 0.5;
              auVar137._0_4_ = (float)(int)fVar60;
              fVar61 = (float)(int)fVar62;
              fVar168 = (float)(int)fVar172;
              fVar173 = (float)(int)fVar174;
              auVar137._0_4_ =
                   auVar137._0_4_ - (float)(-(uint)(fVar60 < auVar137._0_4_) & 0x3f800000);
              fVar61 = fVar61 - (float)(-(uint)(fVar62 < fVar61) & 0x3f800000);
              fVar168 = fVar168 - (float)(-(uint)(fVar172 < fVar168) & 0x3f800000);
              fVar173 = fVar173 - (float)(-(uint)(fVar174 < fVar173) & 0x3f800000);
              fVar60 = auVar137._0_4_ * -0.6931472 + auVar81._0_4_;
              fVar62 = fVar61 * -0.6931472 + auVar81._4_4_;
              fVar172 = fVar168 * -0.6931472 + auVar81._8_4_;
              fVar174 = fVar173 * -0.6931472 + auVar81._12_4_;
              auVar157._0_4_ =
                   (float)((int)auVar137._0_4_ * 0x800000 + 0x3f800000) *
                   (fVar60 + 1.0 +
                   (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                     0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60) + 1.0;
              auVar157._4_4_ =
                   (float)((int)fVar61 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar157._8_4_ =
                   (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar157._12_4_ =
                   (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                   (fVar174 + 1.0 +
                   (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                     0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                   1.0;
              auVar82._8_4_ = 0x3f800000;
              auVar82._0_8_ = 0x3f8000003f800000;
              auVar82._12_4_ = 0x3f800000;
              auVar81 = divps(auVar82,auVar157);
              break;
            case 4:
              auVar119 = minps(auVar81,_DAT_005f2e60);
              auVar119 = maxps(auVar119,_DAT_005f2e70);
              fVar62 = auVar119._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar119._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar119._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar119._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar119._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar119._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar119._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar119._12_4_ - fVar166 * 0.6931472;
              auVar153._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar153._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar153._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar153._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar119 = maxps(auVar153,_DAT_005f2f10);
              fVar62 = (float)(auVar119._0_4_ & 0x807fffff | 0x3f000000);
              fVar172 = (float)(auVar119._4_4_ & 0x807fffff | 0x3f000000);
              fVar174 = (float)(auVar119._8_4_ & 0x807fffff | 0x3f000000);
              fVar165 = (float)(auVar119._12_4_ & 0x807fffff | 0x3f000000);
              fVar168 = fVar62 + -1.0 + (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar62);
              fVar173 = fVar172 + -1.0 + (float)(-(uint)(fVar172 < 0.70710677) & (uint)fVar172);
              fVar160 = fVar174 + -1.0 + (float)(-(uint)(fVar174 < 0.70710677) & (uint)fVar174);
              fVar166 = fVar165 + -1.0 + (float)(-(uint)(fVar165 < 0.70710677) & (uint)fVar165);
              auVar154._0_4_ =
                   ~-(uint)(auVar153._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar62 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar168
                          + (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
              auVar154._4_4_ =
                   ~-(uint)(auVar153._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar172 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar173 +
                          (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) *
                                 fVar173 + -0.12420141) * fVar173 + 0.14249323) * fVar173 +
                              -0.16668057) * fVar173 + 0.20000714) * fVar173 + -0.24999994) *
                            fVar173 + 0.3333333) * fVar173 + -0.5) * fVar173 * fVar173) * -2.0);
              auVar154._8_4_ =
                   ~-(uint)(auVar153._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar174 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar160 +
                          (((((((((fVar160 * 0.070376836 + -0.1151461) * fVar160 + 0.116769984) *
                                 fVar160 + -0.12420141) * fVar160 + 0.14249323) * fVar160 +
                              -0.16668057) * fVar160 + 0.20000714) * fVar160 + -0.24999994) *
                            fVar160 + 0.3333333) * fVar160 + -0.5) * fVar160 * fVar160) * -2.0);
              auVar154._12_4_ =
                   ~-(uint)(auVar153._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar119._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar165 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar166 +
                          (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) *
                                 fVar166 + -0.12420141) * fVar166 + 0.14249323) * fVar166 +
                              -0.16668057) * fVar166 + 0.20000714) * fVar166 + -0.24999994) *
                            fVar166 + 0.3333333) * fVar166 + -0.5) * fVar166 * fVar166) * -2.0);
              auVar131._0_8_ =
                   CONCAT44(-(uint)(auVar153._4_4_ <= 0.0),-(uint)(auVar153._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar131._8_4_ = -(uint)(auVar153._8_4_ <= 0.0) & 0x7fffffff;
              auVar131._12_4_ = -(uint)(auVar153._12_4_ <= 0.0) & 0x7fffffff;
              auVar119 = minps(auVar131 | auVar154,_DAT_005f2e60);
              auVar119 = maxps(auVar119,_DAT_005f2e70);
              fVar62 = auVar119._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar119._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar119._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar119._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar119._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar119._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar119._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar119._12_4_ - fVar166 * 0.6931472;
              auVar155._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar155._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar155._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar155._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar119 = divps(_DAT_005f3b20,auVar155);
              auVar134._0_4_ = auVar119._0_4_ + -1.0;
              auVar134._4_4_ = auVar119._4_4_ + -1.0;
              auVar134._8_4_ = auVar119._8_4_ + -1.0;
              auVar134._12_4_ = auVar119._12_4_ + -1.0;
              goto LAB_002c48c6;
            case 5:
              pfVar38 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar62 = *pfVar38;
              fVar168 = pfVar38[1];
              auVar133._0_4_ = fVar62 * auVar81._0_4_ + fVar168;
              auVar133._4_4_ = fVar62 * auVar137._0_4_ + fVar168;
              auVar133._8_4_ = fVar62 * fVar60 + fVar168;
              auVar133._12_4_ = fVar62 * fVar61 + fVar168;
              auVar119 = maxps(auVar133,_DAT_005f1060);
              auVar17._8_4_ = 0x3f800000;
              auVar17._0_8_ = 0x3f8000003f800000;
              auVar17._12_4_ = 0x3f800000;
              auVar134 = minps(auVar119,auVar17);
LAB_002c48c6:
              auVar81._0_4_ = auVar81._0_4_ * auVar134._0_4_;
              auVar81._4_4_ = auVar137._0_4_ * auVar134._4_4_;
              auVar81._8_4_ = fVar60 * auVar134._8_4_;
              auVar81._12_4_ = fVar61 * auVar134._12_4_;
            }
            auVar135._0_8_ = auVar51._0_8_;
            auVar135._8_4_ = auVar51._4_4_;
            auVar135._12_4_ = auVar109._4_4_;
            auVar83._4_4_ = auVar109._0_4_;
            auVar83._0_4_ = auVar51._0_4_;
            auVar158._0_8_ = auVar64._0_8_;
            auVar158._8_4_ = auVar64._4_4_;
            auVar158._12_4_ = auVar81._4_4_;
            auVar159._8_8_ = auVar158._8_8_;
            auVar83._12_4_ = auVar81._0_4_;
            auVar83._8_4_ = auVar64._0_4_;
            auVar53._0_8_ = CONCAT44(auVar109._8_4_,auVar51._8_4_);
            auVar53._8_4_ = auVar51._12_4_;
            auVar53._12_4_ = auVar109._12_4_;
            auVar66._0_8_ = CONCAT44(auVar81._8_4_,auVar64._8_4_);
            auVar66._8_4_ = auVar64._12_4_;
            auVar66._12_4_ = auVar81._12_4_;
            auVar159._0_8_ = auVar135._8_8_;
            auVar111._8_8_ = auVar66._0_8_;
            auVar111._0_8_ = auVar53._0_8_;
            auVar67._8_8_ = auVar66._8_8_;
            auVar67._0_8_ = auVar53._8_8_;
            *pauVar29 = auVar83;
            pauVar29[1] = auVar159;
            pauVar29[2] = auVar111;
            pauVar29[3] = auVar67;
            pauVar29 = pauVar29 + 4;
            uVar32 = uVar32 + 1;
          } while (uVar32 != local_88);
        }
        if ((iVar9 == 1 & bVar31 & 0 < (int)uVar40) != 0) {
          pauVar29 = (undefined1 (*) [16])
                     (top_blob->w * local_150 * top_blob->elemsize + (long)top_blob->data);
          uVar32 = 0;
          do {
            if (pvVar10 == (void *)0x0) {
              auVar56 = ZEXT816(0);
            }
            else {
              auVar56 = *(undefined1 (*) [16])((long)pvVar10 + uVar32 * 0x10);
            }
            if (0 < (int)uVar41) {
              pfVar38 = (float *)((long)(this->weight_data_tm).w * uVar32 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              lVar37 = 0;
              auVar51 = auVar56;
              do {
                auVar137._0_4_ =
                     *(float *)((long)local_90->data +
                               lVar37 * 4 + local_90->elemsize * local_150 * (long)local_90->w);
                auVar56._0_4_ = auVar51._0_4_ + *pfVar38 * auVar137._0_4_;
                auVar56._4_4_ = auVar51._4_4_ + pfVar38[1] * auVar137._0_4_;
                auVar56._8_4_ = auVar51._8_4_ + pfVar38[2] * auVar137._0_4_;
                auVar56._12_4_ = auVar51._12_4_ + pfVar38[3] * auVar137._0_4_;
                pfVar38 = pfVar38 + 4;
                lVar37 = lVar37 + 1;
                auVar51 = auVar56;
              } while (uVar41 != (uint)lVar37);
            }
            auVar137._0_4_ = auVar56._4_4_;
            fVar60 = auVar56._8_4_;
            fVar61 = auVar56._12_4_;
            switch(iVar28) {
            case 1:
              auVar56 = maxps(auVar56,_DAT_005f1060);
              break;
            case 2:
              auVar64 = maxps(auVar56,ZEXT816(0));
              auVar51 = minps(auVar56,ZEXT816(0));
              auVar137._0_4_ = *(this->super_InnerProduct).activation_params.data;
              auVar56._4_4_ = auVar137._0_4_ * auVar51._4_4_ + auVar64._4_4_;
              auVar56._0_4_ = auVar137._0_4_ * auVar51._0_4_ + auVar64._0_4_;
              auVar56._8_4_ = auVar137._0_4_ * auVar51._8_4_ + auVar64._8_4_;
              auVar56._12_4_ = auVar137._0_4_ * auVar51._12_4_ + auVar64._12_4_;
              break;
            case 3:
              puVar12 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar7 = *puVar12;
              uVar6 = puVar12[1];
              auVar69._4_4_ = uVar7;
              auVar69._0_4_ = uVar7;
              auVar69._8_4_ = uVar7;
              auVar69._12_4_ = uVar7;
              auVar87._4_4_ = uVar6;
              auVar87._0_4_ = uVar6;
              auVar87._8_4_ = uVar6;
              auVar87._12_4_ = uVar6;
              auVar51 = maxps(auVar56,auVar69);
              auVar56 = minps(auVar51,auVar87);
              break;
            case 4:
              auVar54._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
              auVar54._8_4_ = -fVar60;
              auVar54._12_4_ = -fVar61;
              auVar51 = minps(auVar54,_DAT_005f2e60);
              auVar51 = maxps(auVar51,_DAT_005f2e70);
              fVar60 = auVar51._0_4_ * 1.442695 + 0.5;
              fVar62 = auVar51._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar51._8_4_ * 1.442695 + 0.5;
              fVar174 = auVar51._12_4_ * 1.442695 + 0.5;
              auVar137._0_4_ = (float)(int)fVar60;
              fVar61 = (float)(int)fVar62;
              fVar168 = (float)(int)fVar172;
              fVar173 = (float)(int)fVar174;
              auVar137._0_4_ =
                   auVar137._0_4_ - (float)(-(uint)(fVar60 < auVar137._0_4_) & 0x3f800000);
              fVar61 = fVar61 - (float)(-(uint)(fVar62 < fVar61) & 0x3f800000);
              fVar168 = fVar168 - (float)(-(uint)(fVar172 < fVar168) & 0x3f800000);
              fVar173 = fVar173 - (float)(-(uint)(fVar174 < fVar173) & 0x3f800000);
              fVar60 = auVar137._0_4_ * -0.6931472 + auVar51._0_4_;
              fVar62 = fVar61 * -0.6931472 + auVar51._4_4_;
              fVar172 = fVar168 * -0.6931472 + auVar51._8_4_;
              fVar174 = fVar173 * -0.6931472 + auVar51._12_4_;
              auVar88._0_4_ =
                   (float)((int)auVar137._0_4_ * 0x800000 + 0x3f800000) *
                   (fVar60 + 1.0 +
                   (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                     0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60) + 1.0;
              auVar88._4_4_ =
                   (float)((int)fVar61 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar88._8_4_ =
                   (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar88._12_4_ =
                   (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                   (fVar174 + 1.0 +
                   (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                     0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                   1.0;
              auVar55._8_4_ = 0x3f800000;
              auVar55._0_8_ = 0x3f8000003f800000;
              auVar55._12_4_ = 0x3f800000;
              auVar56 = divps(auVar55,auVar88);
              break;
            case 5:
              auVar51 = minps(auVar56,_DAT_005f2e60);
              auVar51 = maxps(auVar51,_DAT_005f2e70);
              fVar62 = auVar51._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar51._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar51._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar51._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar51._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar51._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar51._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar51._12_4_ - fVar166 * 0.6931472;
              auVar84._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar84._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar84._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar84._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar51 = maxps(auVar84,_DAT_005f2f10);
              fVar62 = (float)(auVar51._0_4_ & 0x807fffff | 0x3f000000);
              fVar172 = (float)(auVar51._4_4_ & 0x807fffff | 0x3f000000);
              fVar174 = (float)(auVar51._8_4_ & 0x807fffff | 0x3f000000);
              fVar165 = (float)(auVar51._12_4_ & 0x807fffff | 0x3f000000);
              fVar168 = fVar62 + -1.0 + (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar62);
              fVar173 = fVar172 + -1.0 + (float)(-(uint)(fVar172 < 0.70710677) & (uint)fVar172);
              fVar160 = fVar174 + -1.0 + (float)(-(uint)(fVar174 < 0.70710677) & (uint)fVar174);
              fVar166 = fVar165 + -1.0 + (float)(-(uint)(fVar165 < 0.70710677) & (uint)fVar165);
              auVar85._0_4_ =
                   ~-(uint)(auVar84._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar51._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar62 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar168
                          + (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
              auVar85._4_4_ =
                   ~-(uint)(auVar84._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar51._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar172 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar173 +
                          (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) *
                                 fVar173 + -0.12420141) * fVar173 + 0.14249323) * fVar173 +
                              -0.16668057) * fVar173 + 0.20000714) * fVar173 + -0.24999994) *
                            fVar173 + 0.3333333) * fVar173 + -0.5) * fVar173 * fVar173) * -2.0);
              auVar85._8_4_ =
                   ~-(uint)(auVar84._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar51._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar174 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar160 +
                          (((((((((fVar160 * 0.070376836 + -0.1151461) * fVar160 + 0.116769984) *
                                 fVar160 + -0.12420141) * fVar160 + 0.14249323) * fVar160 +
                              -0.16668057) * fVar160 + 0.20000714) * fVar160 + -0.24999994) *
                            fVar160 + 0.3333333) * fVar160 + -0.5) * fVar160 * fVar160) * -2.0);
              auVar85._12_4_ =
                   ~-(uint)(auVar84._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar51._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar165 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar166 +
                          (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) *
                                 fVar166 + -0.12420141) * fVar166 + 0.14249323) * fVar166 +
                              -0.16668057) * fVar166 + 0.20000714) * fVar166 + -0.24999994) *
                            fVar166 + 0.3333333) * fVar166 + -0.5) * fVar166 * fVar166) * -2.0);
              auVar68._0_8_ =
                   CONCAT44(-(uint)(auVar84._4_4_ <= 0.0),-(uint)(auVar84._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar68._8_4_ = -(uint)(auVar84._8_4_ <= 0.0) & 0x7fffffff;
              auVar68._12_4_ = -(uint)(auVar84._12_4_ <= 0.0) & 0x7fffffff;
              auVar51 = minps(auVar68 | auVar85,_DAT_005f2e60);
              auVar51 = maxps(auVar51,_DAT_005f2e70);
              fVar62 = auVar51._0_4_ * 1.442695 + 0.5;
              fVar168 = auVar51._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar51._8_4_ * 1.442695 + 0.5;
              fVar173 = auVar51._12_4_ * 1.442695 + 0.5;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar166 = (float)(int)fVar173;
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & 0x3f800000);
              fVar62 = auVar51._0_4_ - fVar174 * 0.6931472;
              fVar168 = auVar51._4_4_ - fVar160 * 0.6931472;
              fVar172 = auVar51._8_4_ - fVar165 * 0.6931472;
              fVar173 = auVar51._12_4_ - fVar166 * 0.6931472;
              auVar86._0_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar86._4_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar86._8_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar86._12_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar173 + 1.0 +
                   (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                     0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                   1.0;
              auVar51 = divps(_DAT_005f3b20,auVar86);
              auVar71._0_4_ = auVar51._0_4_ + -1.0;
              auVar71._4_4_ = auVar51._4_4_ + -1.0;
              auVar71._8_4_ = auVar51._8_4_ + -1.0;
              auVar71._12_4_ = auVar51._12_4_ + -1.0;
              goto LAB_002c4d00;
            case 6:
              pfVar38 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar62 = *pfVar38;
              fVar168 = pfVar38[1];
              auVar70._0_4_ = fVar62 * auVar56._0_4_ + fVar168;
              auVar70._4_4_ = fVar62 * auVar137._0_4_ + fVar168;
              auVar70._8_4_ = fVar62 * fVar60 + fVar168;
              auVar70._12_4_ = fVar62 * fVar61 + fVar168;
              auVar51 = maxps(auVar70,_DAT_005f1060);
              auVar18._8_4_ = 0x3f800000;
              auVar18._0_8_ = 0x3f8000003f800000;
              auVar18._12_4_ = 0x3f800000;
              auVar71 = minps(auVar51,auVar18);
LAB_002c4d00:
              auVar56._0_4_ = auVar56._0_4_ * auVar71._0_4_;
              auVar56._4_4_ = auVar137._0_4_ * auVar71._4_4_;
              auVar56._8_4_ = fVar60 * auVar71._8_4_;
              auVar56._12_4_ = fVar61 * auVar71._12_4_;
            }
            *pauVar29 = auVar56;
            pauVar29 = pauVar29 + 1;
            uVar32 = uVar32 + 1;
          } while (uVar32 != local_88);
        }
        if ((iVar9 == 4 && 0 < (long)uVar48) && bVar31 == 0) {
          pauVar29 = (undefined1 (*) [16])
                     (top_blob->w * local_150 * top_blob->elemsize + (long)top_blob->data);
          uVar32 = 0;
          do {
            auVar89 = ZEXT816(0);
            auVar72 = ZEXT816(0);
            if (pvVar10 != (void *)0x0) {
              uVar7 = *(undefined4 *)((long)pvVar10 + uVar32 * 4);
              auVar72._4_4_ = (float)uVar7;
              auVar72._0_4_ = (float)uVar7;
              auVar72._8_4_ = (float)uVar7;
              auVar72._12_4_ = (float)uVar7;
            }
            pfVar38 = (float *)(uVar32 * (long)(int)uVar41 * 4 + (long)(this->weight_data_tm).data);
            pauVar42 = (undefined1 (*) [16])
                       (local_90->w * local_150 * local_90->elemsize + (long)local_90->data);
            uVar45 = 0;
            if ((int)uVar41 < 4) {
              auVar137._0_4_ = 0.0;
              fVar60 = 0.0;
              fVar61 = 0.0;
              fVar62 = 0.0;
              auVar112 = ZEXT816(0);
            }
            else {
              iVar36 = 3;
              auVar137._0_4_ = 0.0;
              fVar60 = 0.0;
              fVar61 = 0.0;
              fVar62 = 0.0;
              auVar51 = auVar72;
              auVar64 = auVar89;
              auVar81 = ZEXT816(0);
              do {
                auVar109 = *pauVar42;
                auVar119 = pauVar42[1];
                auVar121 = pauVar42[3];
                fVar168 = *pfVar38;
                fVar172 = pfVar38[1];
                fVar173 = pfVar38[2];
                fVar174 = pfVar38[3];
                auVar72._0_4_ = auVar51._0_4_ + fVar168 * auVar109._0_4_;
                auVar72._4_4_ = auVar51._4_4_ + fVar168 * auVar109._4_4_;
                auVar72._8_4_ = auVar51._8_4_ + fVar168 * auVar109._8_4_;
                auVar72._12_4_ = auVar51._12_4_ + fVar168 * auVar109._12_4_;
                auVar112._0_4_ = auVar81._0_4_ + fVar172 * auVar119._0_4_;
                auVar112._4_4_ = auVar81._4_4_ + fVar172 * auVar119._4_4_;
                auVar112._8_4_ = auVar81._8_4_ + fVar172 * auVar119._8_4_;
                auVar112._12_4_ = auVar81._12_4_ + fVar172 * auVar119._12_4_;
                auVar137._0_4_ = auVar137._0_4_ + fVar173 * *(float *)pauVar42[2];
                fVar60 = fVar60 + fVar173 * *(float *)(pauVar42[2] + 4);
                fVar61 = fVar61 + fVar173 * *(float *)(pauVar42[2] + 8);
                fVar62 = fVar62 + fVar173 * *(float *)(pauVar42[2] + 0xc);
                auVar89._0_4_ = auVar64._0_4_ + fVar174 * auVar121._0_4_;
                auVar89._4_4_ = auVar64._4_4_ + fVar174 * auVar121._4_4_;
                auVar89._8_4_ = auVar64._8_4_ + fVar174 * auVar121._8_4_;
                auVar89._12_4_ = auVar64._12_4_ + fVar174 * auVar121._12_4_;
                pauVar42 = pauVar42 + 4;
                pfVar38 = pfVar38 + 4;
                iVar36 = iVar36 + 4;
                auVar51 = auVar72;
                auVar64 = auVar89;
                auVar81 = auVar112;
              } while (iVar36 < (int)uVar41);
              uVar45 = uVar41 & 0xfffffffc;
            }
            if ((int)uVar45 < (int)uVar41) {
              lVar37 = 0;
              auVar51 = auVar72;
              do {
                auVar64 = *pauVar42;
                fVar168 = pfVar38[lVar37];
                auVar72._0_4_ = auVar51._0_4_ + fVar168 * auVar64._0_4_;
                auVar72._4_4_ = auVar51._4_4_ + fVar168 * auVar64._4_4_;
                auVar72._8_4_ = auVar51._8_4_ + fVar168 * auVar64._8_4_;
                auVar72._12_4_ = auVar51._12_4_ + fVar168 * auVar64._12_4_;
                pauVar42 = pauVar42 + 1;
                lVar37 = lVar37 + 1;
                auVar51 = auVar72;
              } while (uVar41 - uVar45 != (int)lVar37);
            }
            auVar137._0_4_ = auVar137._0_4_ + auVar89._0_4_ + auVar112._0_4_ + auVar72._0_4_;
            fVar60 = fVar60 + auVar89._4_4_ + auVar112._4_4_ + auVar72._4_4_;
            auVar59._0_8_ = CONCAT44(fVar60,auVar137._0_4_);
            auVar59._8_4_ = fVar61 + auVar89._8_4_ + auVar112._8_4_ + auVar72._8_4_;
            auVar59._12_4_ = fVar62 + auVar89._12_4_ + auVar112._12_4_ + auVar72._12_4_;
            switch(iVar28) {
            case 1:
              auVar59 = maxps(auVar59,_DAT_005f1060);
              break;
            case 2:
              auVar76._8_4_ = auVar59._8_4_;
              auVar76._0_8_ = auVar59._0_8_;
              auVar76._12_4_ = auVar59._12_4_;
              auVar64 = maxps(auVar76,ZEXT816(0));
              auVar51 = minps(auVar59,ZEXT816(0));
              auVar137._0_4_ = *(this->super_InnerProduct).activation_params.data;
              auVar59._4_4_ = auVar137._0_4_ * auVar51._4_4_ + auVar64._4_4_;
              auVar59._0_4_ = auVar137._0_4_ * auVar51._0_4_ + auVar64._0_4_;
              auVar59._8_4_ = auVar137._0_4_ * auVar51._8_4_ + auVar64._8_4_;
              auVar59._12_4_ = auVar137._0_4_ * auVar51._12_4_ + auVar64._12_4_;
              break;
            case 3:
              puVar12 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar7 = *puVar12;
              uVar6 = puVar12[1];
              auVar75._4_4_ = uVar7;
              auVar75._0_4_ = uVar7;
              auVar75._8_4_ = uVar7;
              auVar75._12_4_ = uVar7;
              auVar93._4_4_ = uVar6;
              auVar93._0_4_ = uVar6;
              auVar93._8_4_ = uVar6;
              auVar93._12_4_ = uVar6;
              auVar51 = maxps(auVar59,auVar75);
              auVar59 = minps(auVar51,auVar93);
              break;
            case 4:
              auVar57._0_8_ = CONCAT44(fVar60,auVar137._0_4_) ^ 0x8000000080000000;
              auVar57._8_4_ = -auVar59._8_4_;
              auVar57._12_4_ = -auVar59._12_4_;
              auVar51 = minps(auVar57,_DAT_005f2e60);
              auVar51 = maxps(auVar51,_DAT_005f2e70);
              fVar60 = auVar51._0_4_ * 1.442695 + 0.5;
              fVar62 = auVar51._4_4_ * 1.442695 + 0.5;
              fVar172 = auVar51._8_4_ * 1.442695 + 0.5;
              fVar174 = auVar51._12_4_ * 1.442695 + 0.5;
              auVar137._0_4_ = (float)(int)fVar60;
              fVar61 = (float)(int)fVar62;
              fVar168 = (float)(int)fVar172;
              fVar173 = (float)(int)fVar174;
              auVar137._0_4_ =
                   auVar137._0_4_ - (float)(-(uint)(fVar60 < auVar137._0_4_) & 0x3f800000);
              fVar61 = fVar61 - (float)(-(uint)(fVar62 < fVar61) & 0x3f800000);
              fVar168 = fVar168 - (float)(-(uint)(fVar172 < fVar168) & 0x3f800000);
              fVar173 = fVar173 - (float)(-(uint)(fVar174 < fVar173) & 0x3f800000);
              fVar60 = auVar137._0_4_ * -0.6931472 + auVar51._0_4_;
              fVar62 = fVar61 * -0.6931472 + auVar51._4_4_;
              fVar172 = fVar168 * -0.6931472 + auVar51._8_4_;
              fVar174 = fVar173 * -0.6931472 + auVar51._12_4_;
              auVar94._0_4_ =
                   (float)((int)auVar137._0_4_ * 0x800000 + 0x3f800000) *
                   (fVar60 + 1.0 +
                   (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                     0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60) + 1.0;
              auVar94._4_4_ =
                   (float)((int)fVar61 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar94._8_4_ =
                   (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar94._12_4_ =
                   (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                   (fVar174 + 1.0 +
                   (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                     0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                   1.0;
              auVar58._8_4_ = 0x3f800000;
              auVar58._0_8_ = 0x3f8000003f800000;
              auVar58._12_4_ = 0x3f800000;
              auVar59 = divps(auVar58,auVar94);
              break;
            case 5:
              auVar73._8_4_ = auVar59._8_4_;
              auVar73._0_8_ = auVar59._0_8_;
              auVar73._12_4_ = auVar59._12_4_;
              auVar51 = minps(auVar73,_DAT_005f2e60);
              auVar51 = maxps(auVar51,_DAT_005f2e70);
              fVar61 = auVar51._0_4_ * 1.442695 + 0.5;
              fVar62 = auVar51._4_4_ * 1.442695 + 0.5;
              fVar168 = auVar51._8_4_ * 1.442695 + 0.5;
              fVar172 = auVar51._12_4_ * 1.442695 + 0.5;
              fVar173 = (float)(int)fVar61;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar173 = fVar173 - (float)(-(uint)(fVar61 < fVar173) & 0x3f800000);
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar61 = auVar51._0_4_ - fVar173 * 0.6931472;
              fVar62 = auVar51._4_4_ - fVar174 * 0.6931472;
              fVar168 = auVar51._8_4_ - fVar160 * 0.6931472;
              fVar172 = auVar51._12_4_ - fVar165 * 0.6931472;
              auVar90._0_4_ =
                   (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                   (fVar61 + 1.0 +
                   (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                     0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) * fVar61 * fVar61) + 1.0;
              auVar90._4_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar90._8_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar90._12_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar51 = maxps(auVar90,_DAT_005f2f10);
              fVar61 = (float)(auVar51._0_4_ & 0x807fffff | 0x3f000000);
              fVar168 = (float)(auVar51._4_4_ & 0x807fffff | 0x3f000000);
              fVar173 = (float)(auVar51._8_4_ & 0x807fffff | 0x3f000000);
              fVar160 = (float)(auVar51._12_4_ & 0x807fffff | 0x3f000000);
              fVar62 = fVar61 + -1.0 + (float)(-(uint)(fVar61 < 0.70710677) & (uint)fVar61);
              fVar172 = fVar168 + -1.0 + (float)(-(uint)(fVar168 < 0.70710677) & (uint)fVar168);
              fVar174 = fVar173 + -1.0 + (float)(-(uint)(fVar173 < 0.70710677) & (uint)fVar173);
              fVar165 = fVar160 + -1.0 + (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar160);
              auVar91._0_4_ =
                   ~-(uint)(auVar90._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar51._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar61 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar62
                          + (((((((((fVar62 * 0.070376836 + -0.1151461) * fVar62 + 0.116769984) *
                                   fVar62 + -0.12420141) * fVar62 + 0.14249323) * fVar62 +
                                -0.16668057) * fVar62 + 0.20000714) * fVar62 + -0.24999994) * fVar62
                             + 0.3333333) * fVar62 + -0.5) * fVar62 * fVar62) * -2.0);
              auVar91._4_4_ =
                   ~-(uint)(auVar90._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar51._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar168 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar172 +
                          (((((((((fVar172 * 0.070376836 + -0.1151461) * fVar172 + 0.116769984) *
                                 fVar172 + -0.12420141) * fVar172 + 0.14249323) * fVar172 +
                              -0.16668057) * fVar172 + 0.20000714) * fVar172 + -0.24999994) *
                            fVar172 + 0.3333333) * fVar172 + -0.5) * fVar172 * fVar172) * -2.0);
              auVar91._8_4_ =
                   ~-(uint)(auVar90._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar51._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar173 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar174 +
                          (((((((((fVar174 * 0.070376836 + -0.1151461) * fVar174 + 0.116769984) *
                                 fVar174 + -0.12420141) * fVar174 + 0.14249323) * fVar174 +
                              -0.16668057) * fVar174 + 0.20000714) * fVar174 + -0.24999994) *
                            fVar174 + 0.3333333) * fVar174 + -0.5) * fVar174 * fVar174) * -2.0);
              auVar91._12_4_ =
                   ~-(uint)(auVar90._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar51._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar160 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar165 +
                          (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984) *
                                 fVar165 + -0.12420141) * fVar165 + 0.14249323) * fVar165 +
                              -0.16668057) * fVar165 + 0.20000714) * fVar165 + -0.24999994) *
                            fVar165 + 0.3333333) * fVar165 + -0.5) * fVar165 * fVar165) * -2.0);
              auVar74._0_8_ =
                   CONCAT44(-(uint)(auVar90._4_4_ <= 0.0),-(uint)(auVar90._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar74._8_4_ = -(uint)(auVar90._8_4_ <= 0.0) & 0x7fffffff;
              auVar74._12_4_ = -(uint)(auVar90._12_4_ <= 0.0) & 0x7fffffff;
              auVar51 = minps(auVar74 | auVar91,_DAT_005f2e60);
              auVar51 = maxps(auVar51,_DAT_005f2e70);
              fVar61 = auVar51._0_4_ * 1.442695 + 0.5;
              fVar62 = auVar51._4_4_ * 1.442695 + 0.5;
              fVar168 = auVar51._8_4_ * 1.442695 + 0.5;
              fVar172 = auVar51._12_4_ * 1.442695 + 0.5;
              fVar173 = (float)(int)fVar61;
              fVar174 = (float)(int)fVar62;
              fVar160 = (float)(int)fVar168;
              fVar165 = (float)(int)fVar172;
              fVar173 = fVar173 - (float)(-(uint)(fVar61 < fVar173) & 0x3f800000);
              fVar174 = fVar174 - (float)(-(uint)(fVar62 < fVar174) & 0x3f800000);
              fVar160 = fVar160 - (float)(-(uint)(fVar168 < fVar160) & 0x3f800000);
              fVar165 = fVar165 - (float)(-(uint)(fVar172 < fVar165) & 0x3f800000);
              fVar61 = auVar51._0_4_ - fVar173 * 0.6931472;
              fVar62 = auVar51._4_4_ - fVar174 * 0.6931472;
              fVar168 = auVar51._8_4_ - fVar160 * 0.6931472;
              fVar172 = auVar51._12_4_ - fVar165 * 0.6931472;
              auVar92._0_4_ =
                   (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                   (fVar61 + 1.0 +
                   (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                     0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) * fVar61 * fVar61) + 1.0;
              auVar92._4_4_ =
                   (float)((int)fVar174 * 0x800000 + 0x3f800000) *
                   (fVar62 + 1.0 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62) + 1.0;
              auVar92._8_4_ =
                   (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   1.0;
              auVar92._12_4_ =
                   (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                   (fVar172 + 1.0 +
                   (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                     0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                   1.0;
              auVar51 = divps(_DAT_005f3b20,auVar92);
              auVar78._0_4_ = auVar51._0_4_ + -1.0;
              auVar78._4_4_ = auVar51._4_4_ + -1.0;
              auVar78._8_4_ = auVar51._8_4_ + -1.0;
              auVar78._12_4_ = auVar51._12_4_ + -1.0;
              goto LAB_002c51ab;
            case 6:
              pfVar38 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar61 = *pfVar38;
              fVar62 = pfVar38[1];
              auVar77._0_4_ = fVar61 * auVar137._0_4_ + fVar62;
              auVar77._4_4_ = fVar61 * fVar60 + fVar62;
              auVar77._8_4_ = fVar61 * auVar59._8_4_ + fVar62;
              auVar77._12_4_ = fVar61 * auVar59._12_4_ + fVar62;
              auVar51 = maxps(auVar77,_DAT_005f1060);
              auVar19._8_4_ = 0x3f800000;
              auVar19._0_8_ = 0x3f8000003f800000;
              auVar19._12_4_ = 0x3f800000;
              auVar78 = minps(auVar51,auVar19);
LAB_002c51ab:
              auVar59._0_4_ = auVar137._0_4_ * auVar78._0_4_;
              auVar59._4_4_ = fVar60 * auVar78._4_4_;
              auVar59._8_4_ = auVar59._8_4_ * auVar78._8_4_;
              auVar59._12_4_ = auVar59._12_4_ * auVar78._12_4_;
            }
            *pauVar29 = auVar59;
            pauVar29 = pauVar29 + 1;
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar48);
        }
        if ((iVar9 == 1 && 0 < (long)uVar48) && bVar31 == 0) {
          pfVar39 = (float *)(top_blob->w * local_150 * top_blob->elemsize + (long)top_blob->data);
          pfVar38 = (float *)(this->super_InnerProduct).activation_params.data;
          pvVar11 = (this->weight_data_tm).data;
          pfVar49 = (float *)(local_90->w * local_150 * local_90->elemsize + (long)local_90->data);
          uVar32 = 0;
          do {
            if (pvVar10 == (void *)0x0) {
              auVar137._0_4_ = 0.0;
            }
            else {
              auVar137._0_4_ = *(float *)((long)pvVar10 + uVar32 * 4);
            }
            pfVar30 = (float *)((long)pvVar11 + uVar32 * (long)(int)uVar41 * 4);
            pfVar33 = pfVar49;
            if ((int)uVar41 < 4) {
              uVar45 = 0;
              auVar79 = ZEXT816(0);
            }
            else {
              iVar36 = 3;
              auVar51 = ZEXT816(0);
              do {
                auVar79._0_4_ = auVar51._0_4_ + *pfVar30 * *pfVar33;
                auVar79._4_4_ = auVar51._4_4_ + pfVar30[1] * pfVar33[1];
                auVar79._8_4_ = auVar51._8_4_ + pfVar30[2] * pfVar33[2];
                auVar79._12_4_ = auVar51._12_4_ + pfVar30[3] * pfVar33[3];
                pfVar33 = pfVar33 + 4;
                pfVar30 = pfVar30 + 4;
                iVar36 = iVar36 + 4;
                auVar51 = auVar79;
              } while (iVar36 < (int)uVar41);
              uVar45 = uVar41 & 0xfffffffc;
            }
            if ((int)uVar45 < (int)uVar41) {
              lVar37 = 0;
              do {
                auVar137._0_4_ = auVar137._0_4_ + pfVar30[lVar37] * pfVar33[lVar37];
                lVar37 = lVar37 + 1;
              } while (uVar41 - uVar45 != (int)lVar37);
            }
            fVar60 = auVar79._12_4_ + auVar79._4_4_;
            auVar136._4_4_ = fVar60;
            auVar136._0_4_ = fVar60;
            auVar136._8_4_ = fVar60;
            auVar136._12_4_ = fVar60;
            auVar137._4_12_ = auVar136._4_12_;
            auVar137._0_4_ = fVar60 + auVar79._8_4_ + auVar79._0_4_ + auVar137._0_4_;
            switch(iVar28) {
            case 1:
              if (auVar137._0_4_ <= 0.0) {
                auVar20._12_4_ = 0;
                auVar20._0_12_ = auVar137._4_12_;
                auVar137 = auVar20 << 0x20;
              }
            default:
switchD_002c52c1_default:
              fVar60 = auVar137._0_4_;
              break;
            case 2:
              fVar60 = (float)(~-(uint)(0.0 < auVar137._0_4_) & (uint)*pfVar38 |
                              -(uint)(0.0 < auVar137._0_4_) & 0x3f800000) * auVar137._0_4_;
              break;
            case 3:
              if (auVar137._0_4_ <= *pfVar38) {
                auVar137._0_4_ = *pfVar38;
              }
              fVar60 = pfVar38[1];
              if (auVar137._0_4_ <= fVar60) {
                fVar60 = auVar137._0_4_;
              }
              break;
            case 4:
              if (88.37626 <= auVar137._0_4_) {
                auVar137._0_4_ = 88.37626;
              }
              auVar137._0_4_ =
                   expf((float)(-(uint)(auVar137._0_4_ < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(auVar137._0_4_ < -88.37626) & (uint)-auVar137._0_4_));
              fVar60 = 1.0 / (auVar137._0_4_ + 1.0);
              break;
            case 5:
              local_a8 = auVar137;
              auVar137._0_4_ = expf(auVar137._0_4_);
              auVar137._0_4_ = logf(auVar137._0_4_ + 1.0);
              auVar137._0_4_ = tanhf(auVar137._0_4_);
              fVar60 = auVar137._0_4_ * (float)local_a8._0_4_;
              break;
            case 6:
              fVar61 = *pfVar38;
              fVar62 = -pfVar38[1] / fVar61;
              fVar60 = 0.0;
              if (fVar62 <= auVar137._0_4_) {
                if (fVar62 + 1.0 / fVar61 < auVar137._0_4_) goto switchD_002c52c1_default;
                fVar60 = (fVar61 * auVar137._0_4_ + pfVar38[1]) * auVar137._0_4_;
              }
            }
            *pfVar39 = fVar60;
            pfVar39 = pfVar39 + 1;
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar48);
        }
        local_150 = local_150 + 1;
      } while (local_150 != local_80);
    }
    return 0;
  }
  local_f8 = (float *)bottom_blob->data;
  piVar13 = bottom_blob->refcount;
  uStack_f0 = SUB84(piVar13,0);
  uStack_ec = (undefined4)((ulong)piVar13 >> 0x20);
  local_e8 = (undefined4)bottom_blob->elemsize;
  uStack_e4 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_e0 = bottom_blob->elempack;
  local_d8 = bottom_blob->allocator;
  uVar24 = bottom_blob->w;
  uVar25 = bottom_blob->h;
  uVar26 = bottom_blob->d;
  uVar27 = bottom_blob->c;
  local_b8 = bottom_blob->cstep;
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + 1;
    UNLOCK();
  }
  iStack_cc = uVar24;
  uStack_c8 = uVar25;
  uStack_c4 = uVar26;
  iStack_c0 = uVar27;
  if (bottom_blob->dims != 1) {
    local_78._0_1_ = opt->lightmode;
    local_78._1_1_ = opt->use_shader_pack8;
    local_78._2_1_ = opt->use_subgroup_ops;
    local_78._3_1_ = opt->use_reserved_0;
    local_78._4_4_ = opt->num_threads;
    local_68 = opt->workspace_allocator;
    uStack_60._0_4_ = opt->openmp_blocktime;
    uStack_60._4_1_ = opt->use_winograd_convolution;
    uStack_60._5_1_ = opt->use_sgemm_convolution;
    uStack_60._6_1_ = opt->use_int8_inference;
    uStack_60._7_1_ = opt->use_vulkan_compute;
    local_58[0] = opt->use_bf16_storage;
    local_58[1] = opt->use_fp16_packed;
    local_58[2] = opt->use_fp16_storage;
    local_58[3] = opt->use_fp16_arithmetic;
    local_58[4] = opt->use_int8_packed;
    local_58[5] = opt->use_int8_storage;
    local_58[6] = opt->use_int8_arithmetic;
    local_58[7] = opt->use_packing_layout;
    local_58._8_4_ = opt->vulkan_device_index;
    local_58[0xc] = opt->use_reserved_1;
    local_58[0xd] = opt->use_image_storage;
    local_58[0xe] = opt->use_tensor_storage;
    local_58[0xf] = opt->use_reserved_2;
    local_48._0_4_ = opt->flush_denormals;
    local_48[4] = opt->use_local_pool_allocator;
    local_48[5] = opt->use_shader_local_memory;
    local_48[6] = opt->use_cooperative_matrix;
    local_48[7] = opt->use_winograd23_convolution;
    local_48[8] = opt->use_winograd43_convolution;
    local_48[9] = opt->use_winograd63_convolution;
    local_48[10] = opt->use_a53_a55_optimized_kernel;
    local_48[0xb] = opt->use_fp16_uniform;
    local_48[0xc] = opt->use_int8_uniform;
    local_48[0xd] = opt->use_reserved_9;
    local_48[0xe] = opt->use_reserved_10;
    local_48[0xf] = opt->use_reserved_11;
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_f8);
    if ((local_f8 == (float *)0x0) || ((long)iStack_c0 * local_b8 == 0)) {
      iVar28 = -100;
      goto LAB_002c62cd;
    }
  }
  uVar41 = (this->super_InnerProduct).num_output;
  bVar31 = (uVar41 & 3) == 0 & opt->use_packing_layout;
  iVar28 = (uint)bVar31 + (uint)bVar31 * 2 + 1;
  Mat::create(top_blob,(int)uVar41 / iVar28,
              CONCAT44(uStack_e4,local_e8) / (ulong)(long)local_e0 << bVar31 * '\x02',iVar28,
              opt->blob_allocator);
  pfVar38 = local_f8;
  auVar51 = _DAT_005f2ea0;
  iVar28 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar9 = (this->super_InnerProduct).activation_type;
    uVar40 = local_e0 * iStack_cc;
    uVar41 = top_blob->w;
    pvVar10 = (this->super_InnerProduct).bias_data.data;
    iVar28 = 0;
    auVar137._0_4_ = (float)DAT_005f2ea0;
    fVar60 = DAT_005f2ea0._4_4_;
    fVar61 = DAT_005f2ea0._8_4_;
    fVar62 = DAT_005f2ea0._12_4_;
    if (top_blob->elempack == 1) {
      uVar48 = (ulong)(int)uVar41;
      local_a8._0_8_ = uVar48;
      lVar37 = (long)(int)uVar40;
      if (0 < (int)uVar41 >> 2) {
        local_100 = uVar40 & 0xfffffffc;
        lVar34 = lVar37 * 0x10;
        lVar43 = lVar37 * 4;
        lVar44 = lVar37 * 0xc;
        lVar46 = lVar37 * 8;
        lVar47 = 0;
        uVar32 = 0;
        do {
          uVar5 = uVar32 * 4;
          fVar168 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          if (pvVar10 != (void *)0x0) {
            pfVar39 = (float *)((long)pvVar10 + uVar32 * 0x10);
            fVar168 = *pfVar39;
            fVar172 = pfVar39[1];
            fVar173 = pfVar39[2];
            fVar174 = pfVar39[3];
          }
          pvVar11 = (this->weight_data_tm).data;
          if ((int)uVar40 < 4) {
            uVar45 = 0;
            lVar1 = uVar5 * lVar37 * 4;
            lVar2 = (uVar5 | 1) * lVar37 * 4;
            lVar3 = (uVar5 | 2) * lVar37 * 4;
            lVar4 = (uVar5 | 3) * lVar37 * 4;
            fVar160 = 0.0;
            fVar165 = 0.0;
            fVar166 = 0.0;
            fVar167 = 0.0;
            fVar175 = 0.0;
            fVar176 = 0.0;
            fVar177 = 0.0;
            fVar178 = 0.0;
            fVar179 = 0.0;
            fVar181 = 0.0;
            fVar183 = 0.0;
            fVar185 = 0.0;
            fVar180 = 0.0;
            fVar182 = 0.0;
            fVar184 = 0.0;
            fVar186 = 0.0;
            pfVar39 = local_f8;
          }
          else {
            fVar180 = 0.0;
            fVar182 = 0.0;
            fVar184 = 0.0;
            fVar186 = 0.0;
            iVar28 = 3;
            lVar35 = 0;
            fVar179 = 0.0;
            fVar181 = 0.0;
            fVar183 = 0.0;
            fVar185 = 0.0;
            fVar175 = 0.0;
            fVar176 = 0.0;
            fVar177 = 0.0;
            fVar178 = 0.0;
            fVar160 = 0.0;
            fVar165 = 0.0;
            fVar166 = 0.0;
            fVar167 = 0.0;
            do {
              pfVar39 = (float *)((long)local_f8 + lVar35);
              fVar8 = *pfVar39;
              fVar21 = pfVar39[1];
              fVar22 = pfVar39[2];
              fVar23 = pfVar39[3];
              pfVar39 = (float *)((long)pvVar11 + lVar35 + lVar47);
              pfVar49 = (float *)((long)pvVar11 + lVar35 + lVar43);
              pfVar30 = (float *)((long)pvVar11 + lVar35 + lVar46);
              pfVar33 = (float *)((long)pvVar11 + lVar35 + lVar44);
              fVar180 = fVar180 + *pfVar39 * fVar8;
              fVar182 = fVar182 + pfVar39[1] * fVar21;
              fVar184 = fVar184 + pfVar39[2] * fVar22;
              fVar186 = fVar186 + pfVar39[3] * fVar23;
              fVar160 = fVar160 + *pfVar49 * fVar8;
              fVar165 = fVar165 + pfVar49[1] * fVar21;
              fVar166 = fVar166 + pfVar49[2] * fVar22;
              fVar167 = fVar167 + pfVar49[3] * fVar23;
              fVar175 = fVar175 + *pfVar30 * fVar8;
              fVar176 = fVar176 + pfVar30[1] * fVar21;
              fVar177 = fVar177 + pfVar30[2] * fVar22;
              fVar178 = fVar178 + pfVar30[3] * fVar23;
              fVar179 = fVar179 + *pfVar33 * fVar8;
              fVar181 = fVar181 + pfVar33[1] * fVar21;
              fVar183 = fVar183 + pfVar33[2] * fVar22;
              fVar185 = fVar185 + pfVar33[3] * fVar23;
              lVar35 = lVar35 + 0x10;
              iVar28 = iVar28 + 4;
            } while (iVar28 < (int)uVar40);
            lVar1 = lVar35 + lVar47;
            lVar4 = lVar35 + lVar44;
            lVar3 = lVar35 + lVar46;
            lVar2 = lVar35 + lVar43;
            pfVar39 = (float *)((long)local_f8 + lVar35);
            uVar45 = local_100;
          }
          if (uVar40 - uVar45 != 0 && (int)uVar45 <= (int)uVar40) {
            lVar35 = 0;
            do {
              fVar8 = pfVar39[lVar35];
              fVar168 = fVar168 + fVar8 * *(float *)((long)pvVar11 + lVar35 * 4 + lVar1);
              fVar172 = fVar172 + fVar8 * *(float *)((long)pvVar11 + lVar35 * 4 + lVar2);
              fVar173 = fVar173 + fVar8 * *(float *)((long)pvVar11 + lVar35 * 4 + lVar3);
              fVar174 = fVar174 + fVar8 * *(float *)((long)pvVar11 + lVar35 * 4 + lVar4);
              lVar35 = lVar35 + 1;
            } while (uVar40 - uVar45 != (int)lVar35);
          }
          fVar168 = fVar186 + fVar184 + fVar182 + fVar180 + fVar168;
          fVar172 = fVar167 + fVar166 + fVar165 + fVar160 + fVar172;
          auVar164._0_8_ = CONCAT44(fVar172,fVar168);
          auVar164._8_4_ = fVar178 + fVar177 + fVar176 + fVar175 + fVar173;
          auVar164._12_4_ = fVar185 + fVar183 + fVar181 + fVar179 + fVar174;
          switch(iVar9) {
          case 1:
            auVar164 = maxps(auVar164,ZEXT816(0));
            break;
          case 2:
            auVar105._8_4_ = auVar164._8_4_;
            auVar105._0_8_ = auVar164._0_8_;
            auVar105._12_4_ = auVar164._12_4_;
            auVar64 = maxps(auVar105,ZEXT816(0));
            auVar81 = minps(auVar164,ZEXT816(0));
            fVar168 = *(this->super_InnerProduct).activation_params.data;
            auVar164._4_4_ = fVar168 * auVar81._4_4_ + auVar64._4_4_;
            auVar164._0_4_ = fVar168 * auVar81._0_4_ + auVar64._0_4_;
            auVar164._8_4_ = fVar168 * auVar81._8_4_ + auVar64._8_4_;
            auVar164._12_4_ = fVar168 * auVar81._12_4_ + auVar64._12_4_;
            break;
          case 3:
            puVar12 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar7 = *puVar12;
            uVar6 = puVar12[1];
            auVar104._4_4_ = uVar7;
            auVar104._0_4_ = uVar7;
            auVar104._8_4_ = uVar7;
            auVar104._12_4_ = uVar7;
            auVar117._4_4_ = uVar6;
            auVar117._0_4_ = uVar6;
            auVar117._8_4_ = uVar6;
            auVar117._12_4_ = uVar6;
            auVar64 = maxps(auVar164,auVar104);
            auVar164 = minps(auVar64,auVar117);
            break;
          case 4:
            auVar163._0_8_ = CONCAT44(fVar172,fVar168) ^ 0x8000000080000000;
            auVar163._8_4_ = -auVar164._8_4_;
            auVar163._12_4_ = -auVar164._12_4_;
            auVar64 = minps(auVar163,_DAT_005f2e60);
            auVar64 = maxps(auVar64,_DAT_005f2e70);
            fVar172 = auVar64._0_4_ * 1.442695 + 0.5;
            fVar174 = auVar64._4_4_ * 1.442695 + 0.5;
            fVar165 = auVar64._8_4_ * 1.442695 + 0.5;
            fVar167 = auVar64._12_4_ * 1.442695 + 0.5;
            fVar168 = (float)(int)fVar172;
            fVar173 = (float)(int)fVar174;
            fVar160 = (float)(int)fVar165;
            fVar166 = (float)(int)fVar167;
            fVar168 = fVar168 - (float)(-(uint)(fVar172 < fVar168) & (uint)auVar137._0_4_);
            fVar173 = fVar173 - (float)(-(uint)(fVar174 < fVar173) & (uint)fVar60);
            fVar160 = fVar160 - (float)(-(uint)(fVar165 < fVar160) & (uint)fVar61);
            fVar166 = fVar166 - (float)(-(uint)(fVar167 < fVar166) & (uint)fVar62);
            fVar172 = fVar168 * -0.6931472 + auVar64._0_4_;
            fVar174 = fVar173 * -0.6931472 + auVar64._4_4_;
            fVar165 = fVar160 * -0.6931472 + auVar64._8_4_;
            fVar167 = fVar166 * -0.6931472 + auVar64._12_4_;
            auVar118._0_4_ =
                 (float)((int)fVar168 * 0x800000 + (int)auVar137._0_4_) *
                 (fVar172 + auVar137._0_4_ +
                 (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                   0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                 auVar137._0_4_;
            auVar118._4_4_ =
                 (float)((int)fVar173 * 0x800000 + (int)fVar60) *
                 (fVar174 + fVar60 +
                 (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                   0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                 fVar60;
            auVar118._8_4_ =
                 (float)((int)fVar160 * 0x800000 + (int)fVar61) *
                 (fVar165 + fVar61 +
                 (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                   0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5) * fVar165 * fVar165) +
                 fVar61;
            auVar118._12_4_ =
                 (float)((int)fVar166 * 0x800000 + (int)fVar62) *
                 (fVar167 + fVar62 +
                 (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                   0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) * fVar167 * fVar167) +
                 fVar62;
            auVar164 = divps(auVar51,auVar118);
            break;
          case 5:
            auVar170._8_4_ = auVar164._8_4_;
            auVar170._0_8_ = auVar164._0_8_;
            auVar170._12_4_ = auVar164._12_4_;
            auVar64 = minps(auVar170,_DAT_005f2e60);
            auVar64 = maxps(auVar64,_DAT_005f2e70);
            fVar173 = auVar64._0_4_ * 1.442695 + 0.5;
            fVar174 = auVar64._4_4_ * 1.442695 + 0.5;
            fVar160 = auVar64._8_4_ * 1.442695 + 0.5;
            fVar165 = auVar64._12_4_ * 1.442695 + 0.5;
            fVar166 = (float)(int)fVar173;
            fVar167 = (float)(int)fVar174;
            fVar175 = (float)(int)fVar160;
            fVar176 = (float)(int)fVar165;
            fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & (uint)auVar137._0_4_);
            fVar167 = fVar167 - (float)(-(uint)(fVar174 < fVar167) & (uint)fVar60);
            fVar175 = fVar175 - (float)(-(uint)(fVar160 < fVar175) & (uint)fVar61);
            fVar176 = fVar176 - (float)(-(uint)(fVar165 < fVar176) & (uint)fVar62);
            fVar173 = auVar64._0_4_ - fVar166 * 0.6931472;
            fVar174 = auVar64._4_4_ - fVar167 * 0.6931472;
            fVar160 = auVar64._8_4_ - fVar175 * 0.6931472;
            fVar165 = auVar64._12_4_ - fVar176 * 0.6931472;
            auVar101._0_4_ =
                 (float)((int)fVar166 * 0x800000 + (int)auVar137._0_4_) *
                 (fVar173 + auVar137._0_4_ +
                 (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                   0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                 auVar137._0_4_;
            auVar101._4_4_ =
                 (float)((int)fVar167 * 0x800000 + (int)fVar60) *
                 (fVar174 + fVar60 +
                 (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                   0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                 fVar60;
            auVar101._8_4_ =
                 (float)((int)fVar175 * 0x800000 + (int)fVar61) *
                 (fVar160 + fVar61 +
                 (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) * fVar160 +
                   0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5) * fVar160 * fVar160) +
                 fVar61;
            auVar101._12_4_ =
                 (float)((int)fVar176 * 0x800000 + (int)fVar62) *
                 (fVar165 + fVar62 +
                 (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                   0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5) * fVar165 * fVar165) +
                 fVar62;
            auVar64 = maxps(auVar101,_DAT_005f2f10);
            fVar173 = (float)(auVar64._0_4_ & 0x807fffff | 0x3f000000);
            fVar160 = (float)(auVar64._4_4_ & 0x807fffff | 0x3f000000);
            fVar166 = (float)(auVar64._8_4_ & 0x807fffff | 0x3f000000);
            fVar175 = (float)(auVar64._12_4_ & 0x807fffff | 0x3f000000);
            fVar174 = fVar173 + -1.0 + (float)(-(uint)(fVar173 < 0.70710677) & (uint)fVar173);
            fVar165 = fVar160 + -1.0 + (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar160);
            fVar167 = fVar166 + -1.0 + (float)(-(uint)(fVar166 < 0.70710677) & (uint)fVar166);
            fVar176 = fVar175 + -1.0 + (float)(-(uint)(fVar175 < 0.70710677) & (uint)fVar175);
            auVar102._0_4_ =
                 ~-(uint)(auVar101._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar64._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar173 < 0.70710677) & (uint)auVar137._0_4_)) * 0.6931472
                         + fVar174 +
                        (((((((((fVar174 * 0.070376836 + -0.1151461) * fVar174 + 0.116769984) *
                               fVar174 + -0.12420141) * fVar174 + 0.14249323) * fVar174 +
                            -0.16668057) * fVar174 + 0.20000714) * fVar174 + -0.24999994) * fVar174
                         + 0.3333333) * fVar174 + -0.5) * fVar174 * fVar174) * -2.0);
            auVar102._4_4_ =
                 ~-(uint)(auVar101._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar64._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar60)) * 0.6931472 +
                         fVar165 +
                        (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984) *
                               fVar165 + -0.12420141) * fVar165 + 0.14249323) * fVar165 +
                            -0.16668057) * fVar165 + 0.20000714) * fVar165 + -0.24999994) * fVar165
                         + 0.3333333) * fVar165 + -0.5) * fVar165 * fVar165) * -2.0);
            auVar102._8_4_ =
                 ~-(uint)(auVar101._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar64._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar166 < 0.70710677) & (uint)fVar61)) * 0.6931472 +
                         fVar167 +
                        (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                               fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                            -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) * fVar167
                         + 0.3333333) * fVar167 + -0.5) * fVar167 * fVar167) * -2.0);
            auVar102._12_4_ =
                 ~-(uint)(auVar101._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar64._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar175 < 0.70710677) & (uint)fVar62)) * 0.6931472 +
                         fVar176 +
                        (((((((((fVar176 * 0.070376836 + -0.1151461) * fVar176 + 0.116769984) *
                               fVar176 + -0.12420141) * fVar176 + 0.14249323) * fVar176 +
                            -0.16668057) * fVar176 + 0.20000714) * fVar176 + -0.24999994) * fVar176
                         + 0.3333333) * fVar176 + -0.5) * fVar176 * fVar176) * -2.0);
            auVar171._0_8_ =
                 CONCAT44(-(uint)(auVar101._4_4_ <= 0.0),-(uint)(auVar101._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar171._8_4_ = -(uint)(auVar101._8_4_ <= 0.0) & 0x7fffffff;
            auVar171._12_4_ = -(uint)(auVar101._12_4_ <= 0.0) & 0x7fffffff;
            auVar64 = minps(auVar171 | auVar102,_DAT_005f2e60);
            auVar64 = maxps(auVar64,_DAT_005f2e70);
            fVar166 = auVar64._0_4_ * 1.442695 + 0.5;
            fVar167 = auVar64._4_4_ * 1.442695 + 0.5;
            fVar175 = auVar64._8_4_ * 1.442695 + 0.5;
            fVar176 = auVar64._12_4_ * 1.442695 + 0.5;
            fVar173 = (float)(int)fVar166;
            fVar174 = (float)(int)fVar167;
            fVar160 = (float)(int)fVar175;
            fVar165 = (float)(int)fVar176;
            fVar173 = fVar173 - (float)(-(uint)(fVar166 < fVar173) & (uint)auVar137._0_4_);
            fVar174 = fVar174 - (float)(-(uint)(fVar167 < fVar174) & (uint)fVar60);
            fVar160 = fVar160 - (float)(-(uint)(fVar175 < fVar160) & (uint)fVar61);
            fVar165 = fVar165 - (float)(-(uint)(fVar176 < fVar165) & (uint)fVar62);
            fVar166 = auVar64._0_4_ - fVar173 * 0.6931472;
            fVar167 = auVar64._4_4_ - fVar174 * 0.6931472;
            fVar175 = auVar64._8_4_ - fVar160 * 0.6931472;
            fVar176 = auVar64._12_4_ - fVar165 * 0.6931472;
            auVar103._0_4_ =
                 (float)((int)fVar173 * 0x800000 + (int)auVar137._0_4_) *
                 (fVar166 + auVar137._0_4_ +
                 (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166 +
                   0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5) * fVar166 * fVar166) +
                 auVar137._0_4_;
            auVar103._4_4_ =
                 (float)((int)fVar174 * 0x800000 + (int)fVar60) *
                 (fVar167 + fVar60 +
                 (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                   0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) * fVar167 * fVar167) +
                 fVar60;
            auVar103._8_4_ =
                 (float)((int)fVar160 * 0x800000 + (int)fVar61) *
                 (fVar175 + fVar61 +
                 (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175 +
                   0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175) +
                 fVar61;
            auVar103._12_4_ =
                 (float)((int)fVar165 * 0x800000 + (int)fVar62) *
                 (fVar176 + fVar62 +
                 (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176 +
                   0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176) +
                 fVar62;
            auVar64 = divps(_DAT_005f3b20,auVar103);
            auVar164._0_4_ = fVar168 * (auVar64._0_4_ + -1.0);
            auVar164._4_4_ = fVar172 * (auVar64._4_4_ + -1.0);
            auVar164._8_4_ = auVar164._8_4_ * (auVar64._8_4_ + -1.0);
            auVar164._12_4_ = auVar164._12_4_ * (auVar64._12_4_ + -1.0);
            break;
          case 6:
            pfVar39 = (float *)(this->super_InnerProduct).activation_params.data;
            fVar173 = *pfVar39;
            fVar174 = pfVar39[1];
            auVar106._0_4_ = fVar173 * fVar168 + fVar174;
            auVar106._4_4_ = fVar173 * fVar172 + fVar174;
            auVar106._8_4_ = fVar173 * auVar164._8_4_ + fVar174;
            auVar106._12_4_ = fVar173 * auVar164._12_4_ + fVar174;
            auVar64 = maxps(auVar106,ZEXT816(0));
            auVar64 = minps(auVar64,auVar51);
            auVar164._0_4_ = fVar168 * auVar64._0_4_;
            auVar164._4_4_ = fVar172 * auVar64._4_4_;
            auVar164._8_4_ = auVar164._8_4_ * auVar64._8_4_;
            auVar164._12_4_ = auVar164._12_4_ * auVar64._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar32 * 0x10) = auVar164;
          uVar32 = uVar32 + 1;
          lVar47 = lVar47 + lVar34;
          lVar44 = lVar44 + lVar34;
          lVar46 = lVar46 + lVar34;
          lVar43 = lVar43 + lVar34;
        } while (uVar32 != (uint)((int)uVar41 >> 2));
      }
      uVar32 = uVar48 & 0xfffffffffffffffc;
      iVar28 = 0;
      if ((uint)uVar32 != uVar41) {
        pfVar39 = (float *)(this->super_InnerProduct).activation_params.data;
        pvVar11 = (this->weight_data_tm).data;
        pvVar14 = top_blob->data;
        local_138 = uVar40 & 0xfffffffc;
        do {
          auVar137._0_4_ = 0.0;
          if (pvVar10 != (void *)0x0) {
            auVar137._0_4_ = *(float *)((long)pvVar10 + uVar32 * 4);
          }
          pfVar49 = (float *)((long)pvVar11 + uVar32 * lVar37 * 4);
          pfVar30 = pfVar38;
          if ((int)uVar40 < 4) {
            fVar60 = 0.0;
            fVar61 = 0.0;
            fVar62 = 0.0;
            fVar168 = 0.0;
            uVar41 = 0;
          }
          else {
            fVar60 = 0.0;
            fVar61 = 0.0;
            fVar62 = 0.0;
            fVar168 = 0.0;
            iVar28 = 3;
            do {
              fVar60 = fVar60 + *pfVar49 * *pfVar30;
              fVar61 = fVar61 + pfVar49[1] * pfVar30[1];
              fVar62 = fVar62 + pfVar49[2] * pfVar30[2];
              fVar168 = fVar168 + pfVar49[3] * pfVar30[3];
              pfVar30 = pfVar30 + 4;
              pfVar49 = pfVar49 + 4;
              iVar28 = iVar28 + 4;
              uVar41 = local_138;
            } while (iVar28 < (int)uVar40);
          }
          if (uVar40 - uVar41 != 0 && (int)uVar41 <= (int)uVar40) {
            lVar43 = 0;
            do {
              auVar137._0_4_ = auVar137._0_4_ + pfVar49[lVar43] * pfVar30[lVar43];
              lVar43 = lVar43 + 1;
            } while (uVar40 - uVar41 != (int)lVar43);
          }
          auVar137._0_4_ = fVar168 + fVar61 + fVar62 + fVar60 + auVar137._0_4_;
          fVar60 = auVar137._0_4_;
          switch(iVar9) {
          case 1:
            if (auVar137._0_4_ <= 0.0) {
              fVar60 = 0.0;
            }
            break;
          case 2:
            fVar60 = (float)(~-(uint)(0.0 < auVar137._0_4_) & (uint)*pfVar39 |
                            -(uint)(0.0 < auVar137._0_4_) & 0x3f800000) * auVar137._0_4_;
            break;
          case 3:
            if (auVar137._0_4_ <= *pfVar39) {
              auVar137._0_4_ = *pfVar39;
            }
            fVar60 = pfVar39[1];
            if (auVar137._0_4_ <= pfVar39[1]) {
              fVar60 = auVar137._0_4_;
            }
            break;
          case 4:
            if (88.37626 <= auVar137._0_4_) {
              auVar137._0_4_ = 88.37626;
            }
            auVar137._0_4_ =
                 expf((float)(-(uint)(auVar137._0_4_ < -88.37626) & 0x42b0c0a5 |
                             ~-(uint)(auVar137._0_4_ < -88.37626) & (uint)-auVar137._0_4_));
            uVar48 = local_a8._0_8_;
            fVar60 = 1.0 / (auVar137._0_4_ + 1.0);
            break;
          case 5:
            fVar60 = expf(auVar137._0_4_);
            fVar60 = logf(fVar60 + 1.0);
            fVar60 = tanhf(fVar60);
            uVar48 = local_a8._0_8_;
            fVar60 = fVar60 * auVar137._0_4_;
            break;
          case 6:
            fVar61 = *pfVar39;
            fVar62 = -pfVar39[1] / fVar61;
            fVar60 = 0.0;
            if ((fVar62 <= auVar137._0_4_) &&
               (fVar60 = auVar137._0_4_, auVar137._0_4_ <= fVar62 + 1.0 / fVar61)) {
              fVar60 = (fVar61 * auVar137._0_4_ + pfVar39[1]) * auVar137._0_4_;
            }
          }
          *(float *)((long)pvVar14 + uVar32 * 4) = fVar60;
          uVar32 = uVar32 + 1;
        } while ((long)uVar32 < (long)uVar48);
        iVar28 = 0;
      }
    }
    else if (top_blob->elempack == 4) {
      if (0 < (int)uVar41) {
        uVar48 = 0;
        do {
          fVar168 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          if (pvVar10 != (void *)0x0) {
            pfVar38 = (float *)((long)pvVar10 + uVar48 * 0x10);
            fVar168 = *pfVar38;
            fVar172 = pfVar38[1];
            fVar173 = pfVar38[2];
            fVar174 = pfVar38[3];
          }
          pfVar39 = (float *)((long)(this->weight_data_tm).w * uVar48 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          pfVar38 = local_f8;
          if ((int)uVar40 < 4) {
            fVar175 = 0.0;
            fVar176 = 0.0;
            fVar177 = 0.0;
            fVar178 = 0.0;
            fVar160 = 0.0;
            fVar165 = 0.0;
            fVar166 = 0.0;
            fVar167 = 0.0;
            fVar179 = 0.0;
            fVar181 = 0.0;
            fVar183 = 0.0;
            fVar185 = 0.0;
            uVar45 = 0;
          }
          else {
            fVar179 = 0.0;
            fVar181 = 0.0;
            fVar183 = 0.0;
            fVar185 = 0.0;
            iVar28 = 3;
            fVar160 = 0.0;
            fVar165 = 0.0;
            fVar166 = 0.0;
            fVar167 = 0.0;
            fVar175 = 0.0;
            fVar176 = 0.0;
            fVar177 = 0.0;
            fVar178 = 0.0;
            do {
              fVar180 = *pfVar38;
              fVar182 = pfVar38[1];
              fVar184 = pfVar38[2];
              fVar186 = pfVar38[3];
              fVar168 = fVar168 + *pfVar39 * fVar180;
              fVar172 = fVar172 + pfVar39[1] * fVar180;
              fVar173 = fVar173 + pfVar39[2] * fVar180;
              fVar174 = fVar174 + pfVar39[3] * fVar180;
              fVar179 = fVar179 + pfVar39[4] * fVar182;
              fVar181 = fVar181 + pfVar39[5] * fVar182;
              fVar183 = fVar183 + pfVar39[6] * fVar182;
              fVar185 = fVar185 + pfVar39[7] * fVar182;
              fVar160 = fVar160 + pfVar39[8] * fVar184;
              fVar165 = fVar165 + pfVar39[9] * fVar184;
              fVar166 = fVar166 + pfVar39[10] * fVar184;
              fVar167 = fVar167 + pfVar39[0xb] * fVar184;
              fVar175 = fVar175 + pfVar39[0xc] * fVar186;
              fVar176 = fVar176 + pfVar39[0xd] * fVar186;
              fVar177 = fVar177 + pfVar39[0xe] * fVar186;
              fVar178 = fVar178 + pfVar39[0xf] * fVar186;
              pfVar38 = pfVar38 + 4;
              pfVar39 = pfVar39 + 0x10;
              iVar28 = iVar28 + 4;
              uVar45 = uVar40 & 0xfffffffc;
            } while (iVar28 < (int)uVar40);
          }
          if (uVar40 - uVar45 != 0 && (int)uVar45 <= (int)uVar40) {
            lVar37 = 0;
            do {
              fVar180 = pfVar38[lVar37];
              fVar168 = fVar168 + *pfVar39 * fVar180;
              fVar172 = fVar172 + pfVar39[1] * fVar180;
              fVar173 = fVar173 + pfVar39[2] * fVar180;
              fVar174 = fVar174 + pfVar39[3] * fVar180;
              pfVar39 = pfVar39 + 4;
              lVar37 = lVar37 + 1;
            } while (uVar40 - uVar45 != (int)lVar37);
          }
          fVar168 = fVar160 + fVar175 + fVar179 + fVar168;
          fVar172 = fVar165 + fVar176 + fVar181 + fVar172;
          auVar162._0_8_ = CONCAT44(fVar172,fVar168);
          auVar162._8_4_ = fVar166 + fVar177 + fVar183 + fVar173;
          auVar162._12_4_ = fVar167 + fVar178 + fVar185 + fVar174;
          switch(iVar9) {
          case 1:
            auVar162 = maxps(auVar162,ZEXT816(0));
            break;
          case 2:
            auVar98._8_4_ = auVar162._8_4_;
            auVar98._0_8_ = auVar162._0_8_;
            auVar98._12_4_ = auVar162._12_4_;
            auVar64 = maxps(auVar98,ZEXT816(0));
            auVar81 = minps(auVar162,ZEXT816(0));
            fVar168 = *(this->super_InnerProduct).activation_params.data;
            auVar162._4_4_ = fVar168 * auVar81._4_4_ + auVar64._4_4_;
            auVar162._0_4_ = fVar168 * auVar81._0_4_ + auVar64._0_4_;
            auVar162._8_4_ = fVar168 * auVar81._8_4_ + auVar64._8_4_;
            auVar162._12_4_ = fVar168 * auVar81._12_4_ + auVar64._12_4_;
            break;
          case 3:
            puVar12 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar7 = *puVar12;
            uVar6 = puVar12[1];
            auVar97._4_4_ = uVar7;
            auVar97._0_4_ = uVar7;
            auVar97._8_4_ = uVar7;
            auVar97._12_4_ = uVar7;
            auVar115._4_4_ = uVar6;
            auVar115._0_4_ = uVar6;
            auVar115._8_4_ = uVar6;
            auVar115._12_4_ = uVar6;
            auVar64 = maxps(auVar162,auVar97);
            auVar162 = minps(auVar64,auVar115);
            break;
          case 4:
            auVar161._0_8_ = CONCAT44(fVar172,fVar168) ^ 0x8000000080000000;
            auVar161._8_4_ = -auVar162._8_4_;
            auVar161._12_4_ = -auVar162._12_4_;
            auVar64 = minps(auVar161,_DAT_005f2e60);
            auVar64 = maxps(auVar64,_DAT_005f2e70);
            fVar172 = auVar64._0_4_ * 1.442695 + 0.5;
            fVar174 = auVar64._4_4_ * 1.442695 + 0.5;
            fVar165 = auVar64._8_4_ * 1.442695 + 0.5;
            fVar167 = auVar64._12_4_ * 1.442695 + 0.5;
            fVar168 = (float)(int)fVar172;
            fVar173 = (float)(int)fVar174;
            fVar160 = (float)(int)fVar165;
            fVar166 = (float)(int)fVar167;
            fVar168 = fVar168 - (float)(-(uint)(fVar172 < fVar168) & (uint)auVar137._0_4_);
            fVar173 = fVar173 - (float)(-(uint)(fVar174 < fVar173) & (uint)fVar60);
            fVar160 = fVar160 - (float)(-(uint)(fVar165 < fVar160) & (uint)fVar61);
            fVar166 = fVar166 - (float)(-(uint)(fVar167 < fVar166) & (uint)fVar62);
            fVar172 = fVar168 * -0.6931472 + auVar64._0_4_;
            fVar174 = fVar173 * -0.6931472 + auVar64._4_4_;
            fVar165 = fVar160 * -0.6931472 + auVar64._8_4_;
            fVar167 = fVar166 * -0.6931472 + auVar64._12_4_;
            auVar116._0_4_ =
                 (float)((int)fVar168 * 0x800000 + (int)auVar137._0_4_) *
                 (fVar172 + auVar137._0_4_ +
                 (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
                   0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172) +
                 auVar137._0_4_;
            auVar116._4_4_ =
                 (float)((int)fVar173 * 0x800000 + (int)fVar60) *
                 (fVar174 + fVar60 +
                 (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                   0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                 fVar60;
            auVar116._8_4_ =
                 (float)((int)fVar160 * 0x800000 + (int)fVar61) *
                 (fVar165 + fVar61 +
                 (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                   0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5) * fVar165 * fVar165) +
                 fVar61;
            auVar116._12_4_ =
                 (float)((int)fVar166 * 0x800000 + (int)fVar62) *
                 (fVar167 + fVar62 +
                 (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                   0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) * fVar167 * fVar167) +
                 fVar62;
            auVar162 = divps(auVar51,auVar116);
            break;
          case 5:
            auVar95._8_4_ = auVar162._8_4_;
            auVar95._0_8_ = auVar162._0_8_;
            auVar95._12_4_ = auVar162._12_4_;
            auVar64 = minps(auVar95,_DAT_005f2e60);
            auVar64 = maxps(auVar64,_DAT_005f2e70);
            fVar173 = auVar64._0_4_ * 1.442695 + 0.5;
            fVar174 = auVar64._4_4_ * 1.442695 + 0.5;
            fVar160 = auVar64._8_4_ * 1.442695 + 0.5;
            fVar165 = auVar64._12_4_ * 1.442695 + 0.5;
            fVar166 = (float)(int)fVar173;
            fVar167 = (float)(int)fVar174;
            fVar175 = (float)(int)fVar160;
            fVar176 = (float)(int)fVar165;
            fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & (uint)auVar137._0_4_);
            fVar167 = fVar167 - (float)(-(uint)(fVar174 < fVar167) & (uint)fVar60);
            fVar175 = fVar175 - (float)(-(uint)(fVar160 < fVar175) & (uint)fVar61);
            fVar176 = fVar176 - (float)(-(uint)(fVar165 < fVar176) & (uint)fVar62);
            fVar173 = auVar64._0_4_ - fVar166 * 0.6931472;
            fVar174 = auVar64._4_4_ - fVar167 * 0.6931472;
            fVar160 = auVar64._8_4_ - fVar175 * 0.6931472;
            fVar165 = auVar64._12_4_ - fVar176 * 0.6931472;
            auVar169._0_4_ =
                 (float)((int)fVar166 * 0x800000 + (int)auVar137._0_4_) *
                 (fVar173 + auVar137._0_4_ +
                 (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                   0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                 auVar137._0_4_;
            auVar169._4_4_ =
                 (float)((int)fVar167 * 0x800000 + (int)fVar60) *
                 (fVar174 + fVar60 +
                 (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                   0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                 fVar60;
            auVar169._8_4_ =
                 (float)((int)fVar175 * 0x800000 + (int)fVar61) *
                 (fVar160 + fVar61 +
                 (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) * fVar160 +
                   0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5) * fVar160 * fVar160) +
                 fVar61;
            auVar169._12_4_ =
                 (float)((int)fVar176 * 0x800000 + (int)fVar62) *
                 (fVar165 + fVar62 +
                 (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                   0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5) * fVar165 * fVar165) +
                 fVar62;
            auVar64 = maxps(auVar169,_DAT_005f2f10);
            fVar173 = (float)(auVar64._0_4_ & 0x807fffff | 0x3f000000);
            fVar160 = (float)(auVar64._4_4_ & 0x807fffff | 0x3f000000);
            fVar166 = (float)(auVar64._8_4_ & 0x807fffff | 0x3f000000);
            fVar175 = (float)(auVar64._12_4_ & 0x807fffff | 0x3f000000);
            fVar174 = fVar173 + -1.0 + (float)(-(uint)(fVar173 < 0.70710677) & (uint)fVar173);
            fVar165 = fVar160 + -1.0 + (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar160);
            fVar167 = fVar166 + -1.0 + (float)(-(uint)(fVar166 < 0.70710677) & (uint)fVar166);
            fVar176 = fVar175 + -1.0 + (float)(-(uint)(fVar175 < 0.70710677) & (uint)fVar175);
            auVar113._0_4_ =
                 ~-(uint)(auVar169._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar64._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar173 < 0.70710677) & (uint)auVar137._0_4_)) * 0.6931472
                         + fVar174 +
                        (((((((((fVar174 * 0.070376836 + -0.1151461) * fVar174 + 0.116769984) *
                               fVar174 + -0.12420141) * fVar174 + 0.14249323) * fVar174 +
                            -0.16668057) * fVar174 + 0.20000714) * fVar174 + -0.24999994) * fVar174
                         + 0.3333333) * fVar174 + -0.5) * fVar174 * fVar174) * -2.0);
            auVar113._4_4_ =
                 ~-(uint)(auVar169._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar64._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar60)) * 0.6931472 +
                         fVar165 +
                        (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984) *
                               fVar165 + -0.12420141) * fVar165 + 0.14249323) * fVar165 +
                            -0.16668057) * fVar165 + 0.20000714) * fVar165 + -0.24999994) * fVar165
                         + 0.3333333) * fVar165 + -0.5) * fVar165 * fVar165) * -2.0);
            auVar113._8_4_ =
                 ~-(uint)(auVar169._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar64._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar166 < 0.70710677) & (uint)fVar61)) * 0.6931472 +
                         fVar167 +
                        (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                               fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                            -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) * fVar167
                         + 0.3333333) * fVar167 + -0.5) * fVar167 * fVar167) * -2.0);
            auVar113._12_4_ =
                 ~-(uint)(auVar169._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar64._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar175 < 0.70710677) & (uint)fVar62)) * 0.6931472 +
                         fVar176 +
                        (((((((((fVar176 * 0.070376836 + -0.1151461) * fVar176 + 0.116769984) *
                               fVar176 + -0.12420141) * fVar176 + 0.14249323) * fVar176 +
                            -0.16668057) * fVar176 + 0.20000714) * fVar176 + -0.24999994) * fVar176
                         + 0.3333333) * fVar176 + -0.5) * fVar176 * fVar176) * -2.0);
            auVar96._0_8_ =
                 CONCAT44(-(uint)(auVar169._4_4_ <= 0.0),-(uint)(auVar169._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar96._8_4_ = -(uint)(auVar169._8_4_ <= 0.0) & 0x7fffffff;
            auVar96._12_4_ = -(uint)(auVar169._12_4_ <= 0.0) & 0x7fffffff;
            auVar64 = minps(auVar96 | auVar113,_DAT_005f2e60);
            auVar64 = maxps(auVar64,_DAT_005f2e70);
            fVar173 = auVar64._0_4_ * 1.442695 + 0.5;
            fVar174 = auVar64._4_4_ * 1.442695 + 0.5;
            fVar160 = auVar64._8_4_ * 1.442695 + 0.5;
            fVar165 = auVar64._12_4_ * 1.442695 + 0.5;
            fVar166 = (float)(int)fVar173;
            fVar167 = (float)(int)fVar174;
            fVar175 = (float)(int)fVar160;
            fVar176 = (float)(int)fVar165;
            fVar166 = fVar166 - (float)(-(uint)(fVar173 < fVar166) & (uint)auVar137._0_4_);
            fVar167 = fVar167 - (float)(-(uint)(fVar174 < fVar167) & (uint)fVar60);
            fVar175 = fVar175 - (float)(-(uint)(fVar160 < fVar175) & (uint)fVar61);
            fVar176 = fVar176 - (float)(-(uint)(fVar165 < fVar176) & (uint)fVar62);
            fVar173 = auVar64._0_4_ - fVar166 * 0.6931472;
            fVar174 = auVar64._4_4_ - fVar167 * 0.6931472;
            fVar160 = auVar64._8_4_ - fVar175 * 0.6931472;
            fVar165 = auVar64._12_4_ - fVar176 * 0.6931472;
            auVar114._0_4_ =
                 (float)((int)fVar166 * 0x800000 + (int)auVar137._0_4_) *
                 (fVar173 + auVar137._0_4_ +
                 (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
                   0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) * fVar173 * fVar173) +
                 auVar137._0_4_;
            auVar114._4_4_ =
                 (float)((int)fVar167 * 0x800000 + (int)fVar60) *
                 (fVar174 + fVar60 +
                 (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
                   0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) * fVar174 * fVar174) +
                 fVar60;
            auVar114._8_4_ =
                 (float)((int)fVar175 * 0x800000 + (int)fVar61) *
                 (fVar160 + fVar61 +
                 (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) * fVar160 +
                   0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5) * fVar160 * fVar160) +
                 fVar61;
            auVar114._12_4_ =
                 (float)((int)fVar176 * 0x800000 + (int)fVar62) *
                 (fVar165 + fVar62 +
                 (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                   0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5) * fVar165 * fVar165) +
                 fVar62;
            auVar64 = divps(_DAT_005f3b20,auVar114);
            auVar100._0_4_ = auVar64._0_4_ + -1.0;
            auVar100._4_4_ = auVar64._4_4_ + -1.0;
            auVar100._8_4_ = auVar64._8_4_ + -1.0;
            auVar100._12_4_ = auVar64._12_4_ + -1.0;
            goto LAB_002c5a9d;
          case 6:
            pfVar38 = (float *)(this->super_InnerProduct).activation_params.data;
            fVar173 = *pfVar38;
            fVar174 = pfVar38[1];
            auVar99._0_4_ = fVar173 * fVar168 + fVar174;
            auVar99._4_4_ = fVar173 * fVar172 + fVar174;
            auVar99._8_4_ = fVar173 * auVar162._8_4_ + fVar174;
            auVar99._12_4_ = fVar173 * auVar162._12_4_ + fVar174;
            auVar64 = maxps(auVar99,ZEXT816(0));
            auVar100 = minps(auVar64,auVar51);
LAB_002c5a9d:
            auVar162._0_4_ = fVar168 * auVar100._0_4_;
            auVar162._4_4_ = fVar172 * auVar100._4_4_;
            auVar162._8_4_ = auVar162._8_4_ * auVar100._8_4_;
            auVar162._12_4_ = auVar162._12_4_ * auVar100._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar48 * 0x10) = auVar162;
          uVar48 = uVar48 + 1;
        } while (uVar48 != uVar41);
      }
      iVar28 = 0;
    }
  }
LAB_002c62cd:
  piVar13 = (int *)CONCAT44(uStack_ec,uStack_f0);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_d8 == (Allocator *)0x0) {
        if (local_f8 != (float *)0x0) {
          free(local_f8);
        }
      }
      else {
        (*local_d8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

int InnerProduct_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}